

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<8>::
     intersect_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Geometry *pGVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  ulong uVar22;
  undefined8 uVar23;
  uint uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  byte bVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar76;
  long lVar77;
  long lVar78;
  undefined8 unaff_R13;
  ulong uVar79;
  long lVar80;
  byte bVar81;
  ulong uVar82;
  float fVar83;
  float fVar84;
  float fVar129;
  float fVar131;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar87 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar88 [16];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar89 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined4 uVar135;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar168 [32];
  float fVar174;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar180 [64];
  float fVar181;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 in_ZMM25 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  int local_554;
  ulong local_550;
  long local_548;
  long local_540;
  RayQueryContext *local_538;
  RayHit *local_530;
  ulong local_528;
  Precalculations *local_520;
  Primitive *local_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined1 local_4b0 [16];
  undefined8 local_4a0;
  undefined4 local_498;
  float local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  uint local_484;
  uint local_480;
  ulong local_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined4 local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar70 = (ulong)(byte)prim[1];
  fVar163 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar147 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  fVar153 = fVar163 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar98 = vpmovsxbd_avx2(auVar85);
  fVar181 = fVar163 * auVar147._0_4_;
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar96 = vpmovsxbd_avx2(auVar86);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar103 = vpmovsxbd_avx2(auVar7);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar70 * 0xc + 6);
  auVar99 = vpmovsxbd_avx2(auVar8);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar97 = vpmovsxbd_avx2(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar94 = vpmovsxbd_avx2(auVar10);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar100 = vcvtdq2ps_avx(auVar94);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar70 * 0x13 + 6);
  auVar102 = vpmovsxbd_avx2(auVar11);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar70 * 0x14 + 6);
  auVar101 = vpmovsxbd_avx2(auVar12);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar202._4_4_ = fVar153;
  auVar202._0_4_ = fVar153;
  auVar202._8_4_ = fVar153;
  auVar202._12_4_ = fVar153;
  auVar202._16_4_ = fVar153;
  auVar202._20_4_ = fVar153;
  auVar202._24_4_ = fVar153;
  auVar202._28_4_ = fVar153;
  auVar95 = ZEXT1632(CONCAT412(fVar163 * (ray->super_RayK<1>).dir.field_0.m128[3],
                               CONCAT48(fVar163 * (ray->super_RayK<1>).dir.field_0.m128[2],
                                        CONCAT44(fVar163 * (ray->super_RayK<1>).dir.field_0.m128[1],
                                                 fVar153))));
  auVar91 = vpermps_avx512vl(auVar90,auVar95);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar207 = ZEXT3264(auVar92);
  auVar93 = vpermps_avx512vl(auVar92,auVar95);
  fVar153 = auVar93._0_4_;
  auVar209._0_4_ = fVar153 * auVar104._0_4_;
  fVar144 = auVar93._4_4_;
  auVar209._4_4_ = fVar144 * auVar104._4_4_;
  fVar145 = auVar93._8_4_;
  auVar209._8_4_ = fVar145 * auVar104._8_4_;
  fVar146 = auVar93._12_4_;
  auVar209._12_4_ = fVar146 * auVar104._12_4_;
  fVar172 = auVar93._16_4_;
  auVar209._16_4_ = fVar172 * auVar104._16_4_;
  fVar173 = auVar93._20_4_;
  auVar209._20_4_ = fVar173 * auVar104._20_4_;
  fVar174 = auVar93._24_4_;
  auVar209._28_36_ = in_ZMM4._28_36_;
  auVar209._24_4_ = fVar174 * auVar104._24_4_;
  auVar95._4_4_ = auVar97._4_4_ * fVar144;
  auVar95._0_4_ = auVar97._0_4_ * fVar153;
  auVar95._8_4_ = auVar97._8_4_ * fVar145;
  auVar95._12_4_ = auVar97._12_4_ * fVar146;
  auVar95._16_4_ = auVar97._16_4_ * fVar172;
  auVar95._20_4_ = auVar97._20_4_ * fVar173;
  auVar95._24_4_ = auVar97._24_4_ * fVar174;
  auVar95._28_4_ = auVar94._28_4_;
  auVar94._4_4_ = auVar101._4_4_ * fVar144;
  auVar94._0_4_ = auVar101._0_4_ * fVar153;
  auVar94._8_4_ = auVar101._8_4_ * fVar145;
  auVar94._12_4_ = auVar101._12_4_ * fVar146;
  auVar94._16_4_ = auVar101._16_4_ * fVar172;
  auVar94._20_4_ = auVar101._20_4_ * fVar173;
  auVar94._24_4_ = auVar101._24_4_ * fVar174;
  auVar94._28_4_ = auVar93._28_4_;
  auVar85 = vfmadd231ps_fma(auVar209._0_32_,auVar91,auVar96);
  auVar86 = vfmadd231ps_fma(auVar95,auVar91,auVar99);
  auVar6 = vfmadd231ps_fma(auVar94,auVar102,auVar91);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar202,auVar98);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar202,auVar103);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar100,auVar202);
  auVar203._4_4_ = fVar181;
  auVar203._0_4_ = fVar181;
  auVar203._8_4_ = fVar181;
  auVar203._12_4_ = fVar181;
  auVar203._16_4_ = fVar181;
  auVar203._20_4_ = fVar181;
  auVar203._24_4_ = fVar181;
  auVar203._28_4_ = fVar181;
  auVar95 = ZEXT1632(CONCAT412(fVar163 * auVar147._12_4_,
                               CONCAT48(fVar163 * auVar147._8_4_,
                                        CONCAT44(fVar163 * auVar147._4_4_,fVar181))));
  auVar94 = vpermps_avx512vl(auVar90,auVar95);
  auVar95 = vpermps_avx512vl(auVar92,auVar95);
  fVar163 = auVar95._0_4_;
  auVar186._0_4_ = fVar163 * auVar104._0_4_;
  fVar153 = auVar95._4_4_;
  auVar186._4_4_ = fVar153 * auVar104._4_4_;
  fVar144 = auVar95._8_4_;
  auVar186._8_4_ = fVar144 * auVar104._8_4_;
  fVar145 = auVar95._12_4_;
  auVar186._12_4_ = fVar145 * auVar104._12_4_;
  fVar146 = auVar95._16_4_;
  auVar186._16_4_ = fVar146 * auVar104._16_4_;
  fVar172 = auVar95._20_4_;
  auVar186._20_4_ = fVar172 * auVar104._20_4_;
  fVar173 = auVar95._24_4_;
  auVar186._24_4_ = fVar173 * auVar104._24_4_;
  auVar186._28_4_ = 0;
  auVar90._4_4_ = auVar97._4_4_ * fVar153;
  auVar90._0_4_ = auVar97._0_4_ * fVar163;
  auVar90._8_4_ = auVar97._8_4_ * fVar144;
  auVar90._12_4_ = auVar97._12_4_ * fVar145;
  auVar90._16_4_ = auVar97._16_4_ * fVar146;
  auVar90._20_4_ = auVar97._20_4_ * fVar172;
  auVar90._24_4_ = auVar97._24_4_ * fVar173;
  auVar90._28_4_ = auVar104._28_4_;
  auVar97._4_4_ = auVar101._4_4_ * fVar153;
  auVar97._0_4_ = auVar101._0_4_ * fVar163;
  auVar97._8_4_ = auVar101._8_4_ * fVar144;
  auVar97._12_4_ = auVar101._12_4_ * fVar145;
  auVar97._16_4_ = auVar101._16_4_ * fVar146;
  auVar97._20_4_ = auVar101._20_4_ * fVar172;
  auVar97._24_4_ = auVar101._24_4_ * fVar173;
  auVar97._28_4_ = auVar95._28_4_;
  auVar7 = vfmadd231ps_fma(auVar186,auVar94,auVar96);
  auVar8 = vfmadd231ps_fma(auVar90,auVar94,auVar99);
  auVar9 = vfmadd231ps_fma(auVar97,auVar94,auVar102);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar203,auVar98);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar203,auVar103);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar203,auVar100);
  auVar194._8_4_ = 0x7fffffff;
  auVar194._0_8_ = 0x7fffffff7fffffff;
  auVar194._12_4_ = 0x7fffffff;
  auVar194._16_4_ = 0x7fffffff;
  auVar194._20_4_ = 0x7fffffff;
  auVar194._24_4_ = 0x7fffffff;
  auVar194._28_4_ = 0x7fffffff;
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  auVar189._16_4_ = 0x219392ef;
  auVar189._20_4_ = 0x219392ef;
  auVar189._24_4_ = 0x219392ef;
  auVar189._28_4_ = 0x219392ef;
  auVar98 = vandps_avx(auVar194,ZEXT1632(auVar85));
  uVar79 = vcmpps_avx512vl(auVar98,auVar189,1);
  bVar15 = (bool)((byte)uVar79 & 1);
  auVar91._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._0_4_;
  bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._4_4_;
  bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._8_4_;
  bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(auVar194,ZEXT1632(auVar86));
  uVar79 = vcmpps_avx512vl(auVar98,auVar189,1);
  bVar15 = (bool)((byte)uVar79 & 1);
  auVar92._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._0_4_;
  bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._4_4_;
  bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._8_4_;
  bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar98 = vandps_avx(auVar194,ZEXT1632(auVar6));
  uVar79 = vcmpps_avx512vl(auVar98,auVar189,1);
  bVar15 = (bool)((byte)uVar79 & 1);
  auVar98._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar6._0_4_;
  bVar15 = (bool)((byte)(uVar79 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar6._4_4_;
  bVar15 = (bool)((byte)(uVar79 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar6._8_4_;
  bVar15 = (bool)((byte)(uVar79 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar6._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar79 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar79 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar79 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar79 >> 7) * 0x219392ef;
  auVar96 = vrcp14ps_avx512vl(auVar91);
  auVar190._8_4_ = 0x3f800000;
  auVar190._0_8_ = 0x3f8000003f800000;
  auVar190._12_4_ = 0x3f800000;
  auVar190._16_4_ = 0x3f800000;
  auVar190._20_4_ = 0x3f800000;
  auVar190._24_4_ = 0x3f800000;
  auVar190._28_4_ = 0x3f800000;
  auVar85 = vfnmadd213ps_fma(auVar91,auVar96,auVar190);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar92);
  auVar86 = vfnmadd213ps_fma(auVar92,auVar96,auVar190);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar96,auVar96);
  auVar96 = vrcp14ps_avx512vl(auVar98);
  auVar6 = vfnmadd213ps_fma(auVar98,auVar96,auVar190);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar96,auVar96);
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar7));
  auVar100._4_4_ = auVar85._4_4_ * auVar98._4_4_;
  auVar100._0_4_ = auVar85._0_4_ * auVar98._0_4_;
  auVar100._8_4_ = auVar85._8_4_ * auVar98._8_4_;
  auVar100._12_4_ = auVar85._12_4_ * auVar98._12_4_;
  auVar100._16_4_ = auVar98._16_4_ * 0.0;
  auVar100._20_4_ = auVar98._20_4_ * 0.0;
  auVar100._24_4_ = auVar98._24_4_ * 0.0;
  auVar100._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar7));
  auVar175._0_4_ = auVar85._0_4_ * auVar98._0_4_;
  auVar175._4_4_ = auVar85._4_4_ * auVar98._4_4_;
  auVar175._8_4_ = auVar85._8_4_ * auVar98._8_4_;
  auVar175._12_4_ = auVar85._12_4_ * auVar98._12_4_;
  auVar175._16_4_ = auVar98._16_4_ * 0.0;
  auVar175._20_4_ = auVar98._20_4_ * 0.0;
  auVar175._24_4_ = auVar98._24_4_ * 0.0;
  auVar175._28_4_ = 0;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0xe + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar8));
  auVar102._4_4_ = auVar86._4_4_ * auVar98._4_4_;
  auVar102._0_4_ = auVar86._0_4_ * auVar98._0_4_;
  auVar102._8_4_ = auVar86._8_4_ * auVar98._8_4_;
  auVar102._12_4_ = auVar86._12_4_ * auVar98._12_4_;
  auVar102._16_4_ = auVar98._16_4_ * 0.0;
  auVar102._20_4_ = auVar98._20_4_ * 0.0;
  auVar102._24_4_ = auVar98._24_4_ * 0.0;
  auVar102._28_4_ = auVar98._28_4_;
  auVar97 = vpbroadcastd_avx512vl();
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar8));
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x15 + 6));
  auVar151._0_4_ = auVar86._0_4_ * auVar98._0_4_;
  auVar151._4_4_ = auVar86._4_4_ * auVar98._4_4_;
  auVar151._8_4_ = auVar86._8_4_ * auVar98._8_4_;
  auVar151._12_4_ = auVar86._12_4_ * auVar98._12_4_;
  auVar151._16_4_ = auVar98._16_4_ * 0.0;
  auVar151._20_4_ = auVar98._20_4_ * 0.0;
  auVar151._24_4_ = auVar98._24_4_ * 0.0;
  auVar151._28_4_ = 0;
  auVar98 = vcvtdq2ps_avx(auVar96);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar9));
  auVar101._4_4_ = auVar98._4_4_ * auVar6._4_4_;
  auVar101._0_4_ = auVar98._0_4_ * auVar6._0_4_;
  auVar101._8_4_ = auVar98._8_4_ * auVar6._8_4_;
  auVar101._12_4_ = auVar98._12_4_ * auVar6._12_4_;
  auVar101._16_4_ = auVar98._16_4_ * 0.0;
  auVar101._20_4_ = auVar98._20_4_ * 0.0;
  auVar101._24_4_ = auVar98._24_4_ * 0.0;
  auVar101._28_4_ = auVar98._28_4_;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar9));
  auVar93._0_4_ = auVar6._0_4_ * auVar98._0_4_;
  auVar93._4_4_ = auVar6._4_4_ * auVar98._4_4_;
  auVar93._8_4_ = auVar6._8_4_ * auVar98._8_4_;
  auVar93._12_4_ = auVar6._12_4_ * auVar98._12_4_;
  auVar93._16_4_ = auVar98._16_4_ * 0.0;
  auVar93._20_4_ = auVar98._20_4_ * 0.0;
  auVar93._24_4_ = auVar98._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar98 = vpminsd_avx2(auVar100,auVar175);
  auVar96 = vpminsd_avx2(auVar102,auVar151);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96 = vpminsd_avx2(auVar101,auVar93);
  uVar135 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar104._4_4_ = uVar135;
  auVar104._0_4_ = uVar135;
  auVar104._8_4_ = uVar135;
  auVar104._12_4_ = uVar135;
  auVar104._16_4_ = uVar135;
  auVar104._20_4_ = uVar135;
  auVar104._24_4_ = uVar135;
  auVar104._28_4_ = uVar135;
  auVar96 = vmaxps_avx512vl(auVar96,auVar104);
  auVar98 = vmaxps_avx(auVar98,auVar96);
  auVar96._8_4_ = 0x3f7ffffa;
  auVar96._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar96._12_4_ = 0x3f7ffffa;
  auVar96._16_4_ = 0x3f7ffffa;
  auVar96._20_4_ = 0x3f7ffffa;
  auVar96._24_4_ = 0x3f7ffffa;
  auVar96._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar98,auVar96);
  auVar98 = vpmaxsd_avx2(auVar100,auVar175);
  auVar96 = vpmaxsd_avx2(auVar102,auVar151);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar96 = vpmaxsd_avx2(auVar101,auVar93);
  fVar163 = (ray->super_RayK<1>).tfar;
  auVar103._4_4_ = fVar163;
  auVar103._0_4_ = fVar163;
  auVar103._8_4_ = fVar163;
  auVar103._12_4_ = fVar163;
  auVar103._16_4_ = fVar163;
  auVar103._20_4_ = fVar163;
  auVar103._24_4_ = fVar163;
  auVar103._28_4_ = fVar163;
  auVar96 = vminps_avx512vl(auVar96,auVar103);
  auVar98 = vminps_avx(auVar98,auVar96);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar98 = vmulps_avx512vl(auVar98,auVar99);
  uVar21 = vcmpps_avx512vl(local_80,auVar98,2);
  uVar23 = vpcmpgtd_avx512vl(auVar97,_DAT_01fb4ba0);
  uVar79 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar21 & (byte)uVar23));
  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar209 = ZEXT1664(auVar85);
  local_530 = ray;
  local_538 = context;
  local_518 = prim;
  local_520 = pre;
  do {
    if (uVar79 == 0) {
      return;
    }
    lVar78 = 0;
    for (uVar70 = uVar79; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      lVar78 = lVar78 + 1;
    }
    uVar72 = *(uint *)(prim + 2);
    uVar73 = *(uint *)(prim + lVar78 * 4 + 6);
    local_550 = (ulong)uVar72;
    pGVar13 = (context->scene->geometries).items[uVar72].ptr;
    local_528 = (ulong)uVar73;
    lVar78 = *(long *)&pGVar13[1].time_range.upper;
    uVar70 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                             (ulong)uVar73 *
                             pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    lVar74 = (long)pGVar13[1].intersectionFilterN * uVar70;
    local_4b0 = *(undefined1 (*) [16])(lVar78 + lVar74);
    lVar77 = (long)pGVar13[1].intersectionFilterN * (uVar70 + 1);
    _local_4c0 = *(undefined1 (*) [16])(lVar78 + lVar77);
    iVar76 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar147._8_4_ = 0xbeaaaaab;
    auVar147._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar147._12_4_ = 0xbeaaaaab;
    local_4d0 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar13[2].intersectionFilterN +
                                  uVar70 * (long)pGVar13[2].pointQueryFunc),local_4b0,auVar147);
    local_4e0 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar13[2].intersectionFilterN +
                                 (long)pGVar13[2].pointQueryFunc * (uVar70 + 1)),_local_4c0,auVar147
                               );
    aVar3 = (ray->super_RayK<1>).org.field_0;
    auVar89 = local_4b0;
    auVar86 = vsubps_avx(local_4b0,(undefined1  [16])aVar3);
    uVar135 = auVar86._0_4_;
    auVar148._4_4_ = uVar135;
    auVar148._0_4_ = uVar135;
    auVar148._8_4_ = uVar135;
    auVar148._12_4_ = uVar135;
    auVar85 = vshufps_avx(auVar86,auVar86,0x55);
    aVar4 = (pre->ray_space).vx.field_0;
    aVar5 = (pre->ray_space).vy.field_0;
    fVar163 = (pre->ray_space).vz.field_0.m128[0];
    fVar153 = (pre->ray_space).vz.field_0.m128[1];
    fVar144 = (pre->ray_space).vz.field_0.m128[2];
    fVar145 = (pre->ray_space).vz.field_0.m128[3];
    auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar193._0_4_ = auVar86._0_4_ * fVar163;
    auVar193._4_4_ = auVar86._4_4_ * fVar153;
    auVar193._8_4_ = auVar86._8_4_ * fVar144;
    auVar193._12_4_ = auVar86._12_4_ * fVar145;
    auVar85 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar5,auVar85);
    auVar6 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar148);
    auVar86 = vsubps_avx(local_4d0,(undefined1  [16])aVar3);
    uVar135 = auVar86._0_4_;
    auVar149._4_4_ = uVar135;
    auVar149._0_4_ = uVar135;
    auVar149._8_4_ = uVar135;
    auVar149._12_4_ = uVar135;
    auVar85 = vshufps_avx(auVar86,auVar86,0x55);
    auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar195._0_4_ = auVar86._0_4_ * fVar163;
    auVar195._4_4_ = auVar86._4_4_ * fVar153;
    auVar195._8_4_ = auVar86._8_4_ * fVar144;
    auVar195._12_4_ = auVar86._12_4_ * fVar145;
    auVar85 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar85);
    auVar7 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar149);
    auVar86 = vsubps_avx(local_4e0,(undefined1  [16])aVar3);
    uVar135 = auVar86._0_4_;
    auVar150._4_4_ = uVar135;
    auVar150._0_4_ = uVar135;
    auVar150._8_4_ = uVar135;
    auVar150._12_4_ = uVar135;
    auVar85 = vshufps_avx(auVar86,auVar86,0x55);
    auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar88._0_4_ = auVar86._0_4_ * fVar163;
    auVar88._4_4_ = auVar86._4_4_ * fVar153;
    auVar88._8_4_ = auVar86._8_4_ * fVar144;
    auVar88._12_4_ = auVar86._12_4_ * fVar145;
    auVar85 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar5,auVar85);
    auVar8 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar150);
    auVar150 = _local_4c0;
    local_3c0 = ZEXT1632((undefined1  [16])aVar3);
    auVar86 = vsubps_avx(_local_4c0,(undefined1  [16])aVar3);
    uVar135 = auVar86._0_4_;
    auVar87._4_4_ = uVar135;
    auVar87._0_4_ = uVar135;
    auVar87._8_4_ = uVar135;
    auVar87._12_4_ = uVar135;
    auVar85 = vshufps_avx(auVar86,auVar86,0x55);
    auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar198._0_4_ = auVar86._0_4_ * fVar163;
    auVar198._4_4_ = auVar86._4_4_ * fVar153;
    auVar198._8_4_ = auVar86._8_4_ * fVar144;
    auVar198._12_4_ = auVar86._12_4_ * fVar145;
    auVar85 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar85);
    auVar9 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar87);
    lVar75 = (long)iVar76;
    lVar80 = lVar75 * 0x44;
    auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar80);
    uVar135 = auVar6._0_4_;
    local_2a0._4_4_ = uVar135;
    local_2a0._0_4_ = uVar135;
    local_2a0._8_4_ = uVar135;
    local_2a0._12_4_ = uVar135;
    local_2a0._16_4_ = uVar135;
    local_2a0._20_4_ = uVar135;
    local_2a0._24_4_ = uVar135;
    local_2a0._28_4_ = uVar135;
    auVar136._8_4_ = 1;
    auVar136._0_8_ = 0x100000001;
    auVar136._12_4_ = 1;
    auVar136._16_4_ = 1;
    auVar136._20_4_ = 1;
    auVar136._24_4_ = 1;
    auVar136._28_4_ = 1;
    local_2c0 = vpermps_avx2(auVar136,ZEXT1632(auVar6));
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 + 0x484);
    local_2e0 = vbroadcastss_avx512vl(auVar7);
    auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 + 0x908);
    local_300 = vpermps_avx512vl(auVar136,ZEXT1632(auVar7));
    local_320 = vbroadcastss_avx512vl(auVar8);
    local_340 = vpermps_avx512vl(auVar136,ZEXT1632(auVar8));
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 + 0xd8c);
    fVar153 = auVar9._0_4_;
    local_360._4_4_ = fVar153;
    local_360._0_4_ = fVar153;
    fStack_358 = fVar153;
    fStack_354 = fVar153;
    fStack_350 = fVar153;
    fStack_34c = fVar153;
    fStack_348 = fVar153;
    register0x0000139c = fVar153;
    _local_380 = vpermps_avx512vl(auVar136,ZEXT1632(auVar9));
    auVar99 = vmulps_avx512vl(_local_360,auVar103);
    auVar97 = vmulps_avx512vl(_local_380,auVar103);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_320);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar104,local_340);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_2e0);
    auVar100 = vfmadd231ps_avx512vl(auVar97,auVar96,local_300);
    auVar10 = vfmadd231ps_fma(auVar99,auVar98,local_2a0);
    auVar187 = ZEXT1664(auVar10);
    auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar80);
    auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 + 0x484);
    auVar11 = vfmadd231ps_fma(auVar100,auVar98,local_2c0);
    auVar180 = ZEXT1664(auVar11);
    auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 + 0x908);
    auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 + 0xd8c);
    auVar101 = vmulps_avx512vl(_local_360,auVar102);
    auVar94 = vmulps_avx512vl(_local_380,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,local_320);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_340);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_2e0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,local_300);
    auVar12 = vfmadd231ps_fma(auVar101,auVar99,local_2a0);
    auVar191 = ZEXT1664(auVar12);
    auVar147 = vfmadd231ps_fma(auVar94,auVar99,local_2c0);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar10));
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar147),ZEXT1632(auVar11));
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar11),auVar101);
    auVar90 = vmulps_avx512vl(ZEXT1632(auVar10),auVar94);
    auVar95 = vsubps_avx512vl(auVar95,auVar90);
    auVar85 = vshufps_avx(local_4d0,local_4d0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar85);
    auVar85 = vshufps_avx(local_4e0,local_4e0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar85);
    local_e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar78 + 0xc + lVar77)));
    auVar90 = vmulps_avx512vl(local_e0,auVar103);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar104,local_c0);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_a0);
    local_100 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar78 + 0xc + lVar74)));
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,local_100);
    auVar91 = vmulps_avx512vl(local_e0,auVar102);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar100,local_c0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar97,local_a0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar99,local_100);
    auVar92 = vmulps_avx512vl(auVar94,auVar94);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar101,auVar101);
    auVar93 = vmaxps_avx512vl(auVar90,auVar91);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    auVar92 = vmulps_avx512vl(auVar93,auVar92);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    uVar21 = vcmpps_avx512vl(auVar95,auVar92,2);
    auVar85 = vinsertps_avx512f(auVar6,local_100._0_16_,0x30);
    auVar193 = auVar209._0_16_;
    auVar86 = vandps_avx512vl(auVar85,auVar193);
    auVar149 = local_4d0;
    auVar85 = vblendps_avx(auVar7,local_4d0,8);
    auVar85 = vandps_avx512vl(auVar85,auVar193);
    auVar86 = vmaxps_avx512vl(auVar86,auVar85);
    auVar148 = local_4e0;
    auVar85 = vblendps_avx(auVar8,local_4e0,8);
    auVar87 = vandps_avx512vl(auVar85,auVar193);
    auVar85 = vinsertps_avx512f(auVar9,local_e0._0_16_,0x30);
    auVar85 = vandps_avx512vl(auVar85,auVar193);
    auVar85 = vmaxps_avx512vl(auVar87,auVar85);
    auVar85 = vmaxps_avx(auVar86,auVar85);
    auVar86 = vmovshdup_avx(auVar85);
    auVar86 = vmaxss_avx(auVar86,auVar85);
    auVar85 = vshufpd_avx(auVar85,auVar85,1);
    auVar85 = vmaxss_avx(auVar85,auVar86);
    auVar86 = vcvtsi2ss_avx512f(in_ZMM25._0_16_,iVar76);
    local_460._0_16_ = auVar86;
    auVar201._0_4_ = auVar86._0_4_;
    auVar201._4_4_ = auVar201._0_4_;
    auVar201._8_4_ = auVar201._0_4_;
    auVar201._12_4_ = auVar201._0_4_;
    auVar201._16_4_ = auVar201._0_4_;
    auVar201._20_4_ = auVar201._0_4_;
    auVar201._24_4_ = auVar201._0_4_;
    auVar201._28_4_ = auVar201._0_4_;
    uVar23 = vcmpps_avx512vl(auVar201,_DAT_01f7b060,0xe);
    bVar81 = (byte)uVar21 & (byte)uVar23;
    fVar163 = auVar85._0_4_ * 4.7683716e-07;
    local_440._0_16_ = ZEXT416((uint)fVar163);
    auVar95 = auVar207._0_32_;
    local_400 = vpermps_avx512vl(auVar95,ZEXT1632(auVar6));
    auVar208 = ZEXT3264(local_400);
    local_120 = vpermps_avx512vl(auVar95,ZEXT1632(auVar7));
    local_140 = vpermps_avx512vl(auVar95,ZEXT1632(auVar8));
    local_160 = vpermps_avx512vl(auVar95,ZEXT1632(auVar9));
    local_4e0 = auVar148;
    local_4d0 = auVar149;
    _local_4c0 = auVar150;
    local_4b0 = auVar89;
    if (bVar81 != 0) {
      in_ZMM25 = ZEXT3264(local_160);
      auVar102 = vmulps_avx512vl(local_160,auVar102);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar102);
      auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar100);
      auVar97 = vfmadd213ps_avx512vl(auVar99,local_400,auVar97);
      auVar103 = vmulps_avx512vl(local_160,auVar103);
      auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
      auVar100 = vfmadd213ps_avx512vl(auVar96,local_120,auVar104);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 + 0x1210);
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 + 0x1b18);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar80 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar98,local_400,auVar100);
      auVar196._0_4_ = fVar153 * auVar99._0_4_;
      auVar196._4_4_ = fVar153 * auVar99._4_4_;
      auVar196._8_4_ = fVar153 * auVar99._8_4_;
      auVar196._12_4_ = fVar153 * auVar99._12_4_;
      auVar196._16_4_ = fVar153 * auVar99._16_4_;
      auVar196._20_4_ = fVar153 * auVar99._20_4_;
      auVar196._24_4_ = fVar153 * auVar99._24_4_;
      auVar196._28_4_ = 0;
      auVar98 = vmulps_avx512vl(_local_380,auVar99);
      auVar99 = vmulps_avx512vl(local_160,auVar99);
      auVar102 = vfmadd231ps_avx512vl(auVar196,auVar103,local_320);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar103,local_340);
      auVar103 = vfmadd231ps_avx512vl(auVar99,local_140,auVar103);
      auVar99 = vfmadd231ps_avx512vl(auVar102,auVar104,local_2e0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar104,local_300);
      auVar102 = vfmadd231ps_avx512vl(auVar103,local_120,auVar104);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar96,local_2a0);
      auVar95 = vfmadd231ps_avx512vl(auVar98,auVar96,local_2c0);
      auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 + 0x1210);
      auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 + 0x1b18);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 + 0x1f9c);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_400,auVar96);
      auVar96 = vmulps_avx512vl(_local_360,auVar103);
      auVar92 = vmulps_avx512vl(_local_380,auVar103);
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar209 = ZEXT1664(auVar85);
      auVar103 = vmulps_avx512vl(local_160,auVar103);
      auVar93 = vfmadd231ps_avx512vl(auVar96,auVar104,local_320);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar104,local_340);
      auVar104 = vfmadd231ps_avx512vl(auVar103,local_140,auVar104);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar80 + 0x1694);
      auVar103 = vfmadd231ps_avx512vl(auVar93,auVar96,local_2e0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,local_300);
      auVar96 = vfmadd231ps_avx512vl(auVar104,local_120,auVar96);
      auVar104 = vfmadd231ps_avx512vl(auVar103,auVar98,local_2a0);
      auVar103 = vfmadd231ps_avx512vl(auVar92,auVar98,local_2c0);
      auVar92 = vfmadd231ps_avx512vl(auVar96,local_400,auVar98);
      auVar204._8_4_ = 0x7fffffff;
      auVar204._0_8_ = 0x7fffffff7fffffff;
      auVar204._12_4_ = 0x7fffffff;
      auVar204._16_4_ = 0x7fffffff;
      auVar204._20_4_ = 0x7fffffff;
      auVar204._24_4_ = 0x7fffffff;
      auVar204._28_4_ = 0x7fffffff;
      auVar98 = vandps_avx(auVar99,auVar204);
      auVar96 = vandps_avx(auVar95,auVar204);
      auVar96 = vmaxps_avx(auVar98,auVar96);
      auVar98 = vandps_avx(auVar102,auVar204);
      auVar98 = vmaxps_avx(auVar96,auVar98);
      auVar200._4_4_ = fVar163;
      auVar200._0_4_ = fVar163;
      auVar200._8_4_ = fVar163;
      auVar200._12_4_ = fVar163;
      auVar200._16_4_ = fVar163;
      auVar200._20_4_ = fVar163;
      auVar200._24_4_ = fVar163;
      auVar200._28_4_ = fVar163;
      uVar70 = vcmpps_avx512vl(auVar98,auVar200,1);
      bVar15 = (bool)((byte)uVar70 & 1);
      auVar105._0_4_ = (float)((uint)bVar15 * auVar101._0_4_ | (uint)!bVar15 * auVar99._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar15 * auVar101._4_4_ | (uint)!bVar15 * auVar99._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar15 * auVar101._8_4_ | (uint)!bVar15 * auVar99._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar15 * auVar101._12_4_ | (uint)!bVar15 * auVar99._12_4_);
      bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar15 * auVar101._16_4_ | (uint)!bVar15 * auVar99._16_4_);
      bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar15 * auVar101._20_4_ | (uint)!bVar15 * auVar99._20_4_);
      bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar15 * auVar101._24_4_ | (uint)!bVar15 * auVar99._24_4_);
      bVar15 = SUB81(uVar70 >> 7,0);
      auVar105._28_4_ = (uint)bVar15 * auVar101._28_4_ | (uint)!bVar15 * auVar99._28_4_;
      bVar15 = (bool)((byte)uVar70 & 1);
      auVar106._0_4_ = (float)((uint)bVar15 * auVar94._0_4_ | (uint)!bVar15 * auVar95._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar95._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar95._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar95._12_4_);
      bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar106._16_4_ = (float)((uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * auVar95._16_4_);
      bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar106._20_4_ = (float)((uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * auVar95._20_4_);
      bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar106._24_4_ = (float)((uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * auVar95._24_4_);
      bVar15 = SUB81(uVar70 >> 7,0);
      auVar106._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar95._28_4_;
      vandps_avx512vl(auVar104,auVar204);
      auVar98 = vandps_avx(auVar103,auVar204);
      auVar96 = vmaxps_avx(auVar106,auVar98);
      auVar98 = vandps_avx(auVar92,auVar204);
      auVar98 = vmaxps_avx(auVar96,auVar98);
      uVar70 = vcmpps_avx512vl(auVar98,auVar200,1);
      bVar15 = (bool)((byte)uVar70 & 1);
      auVar107._0_4_ = (uint)bVar15 * auVar101._0_4_ | (uint)!bVar15 * auVar104._0_4_;
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar15 * auVar101._4_4_ | (uint)!bVar15 * auVar104._4_4_;
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar15 * auVar101._8_4_ | (uint)!bVar15 * auVar104._8_4_;
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar15 * auVar101._12_4_ | (uint)!bVar15 * auVar104._12_4_;
      bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar107._16_4_ = (uint)bVar15 * auVar101._16_4_ | (uint)!bVar15 * auVar104._16_4_;
      bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar107._20_4_ = (uint)bVar15 * auVar101._20_4_ | (uint)!bVar15 * auVar104._20_4_;
      bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar107._24_4_ = (uint)bVar15 * auVar101._24_4_ | (uint)!bVar15 * auVar104._24_4_;
      bVar15 = SUB81(uVar70 >> 7,0);
      auVar107._28_4_ = (uint)bVar15 * auVar101._28_4_ | (uint)!bVar15 * auVar104._28_4_;
      bVar15 = (bool)((byte)uVar70 & 1);
      auVar108._0_4_ = (float)((uint)bVar15 * auVar94._0_4_ | (uint)!bVar15 * auVar103._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar103._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar103._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar103._12_4_);
      bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * auVar103._16_4_);
      bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * auVar103._20_4_);
      bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * auVar103._24_4_);
      bVar15 = SUB81(uVar70 >> 7,0);
      auVar108._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar103._28_4_;
      auVar199._8_4_ = 0x80000000;
      auVar199._0_8_ = 0x8000000080000000;
      auVar199._12_4_ = 0x80000000;
      auVar199._16_4_ = 0x80000000;
      auVar199._20_4_ = 0x80000000;
      auVar199._24_4_ = 0x80000000;
      auVar199._28_4_ = 0x80000000;
      auVar98 = vxorps_avx512vl(auVar107,auVar199);
      auVar88 = vxorps_avx512vl(local_2c0._0_16_,local_2c0._0_16_);
      auVar96 = vfmadd213ps_avx512vl(auVar105,auVar105,ZEXT1632(auVar88));
      auVar85 = vfmadd231ps_fma(auVar96,auVar106,auVar106);
      auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar85));
      auVar205._8_4_ = 0xbf000000;
      auVar205._0_8_ = 0xbf000000bf000000;
      auVar205._12_4_ = 0xbf000000;
      auVar205._16_4_ = 0xbf000000;
      auVar205._20_4_ = 0xbf000000;
      auVar205._24_4_ = 0xbf000000;
      auVar205._28_4_ = 0xbf000000;
      fVar163 = auVar96._0_4_;
      fVar153 = auVar96._4_4_;
      fVar144 = auVar96._8_4_;
      fVar145 = auVar96._12_4_;
      fVar146 = auVar96._16_4_;
      fVar172 = auVar96._20_4_;
      fVar173 = auVar96._24_4_;
      auVar36._4_4_ = fVar153 * fVar153 * fVar153 * auVar85._4_4_ * -0.5;
      auVar36._0_4_ = fVar163 * fVar163 * fVar163 * auVar85._0_4_ * -0.5;
      auVar36._8_4_ = fVar144 * fVar144 * fVar144 * auVar85._8_4_ * -0.5;
      auVar36._12_4_ = fVar145 * fVar145 * fVar145 * auVar85._12_4_ * -0.5;
      auVar36._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar36._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
      auVar36._24_4_ = fVar173 * fVar173 * fVar173 * -0.0;
      auVar36._28_4_ = 0;
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar103 = vfmadd231ps_avx512vl(auVar36,auVar104,auVar96);
      auVar37._4_4_ = auVar106._4_4_ * auVar103._4_4_;
      auVar37._0_4_ = auVar106._0_4_ * auVar103._0_4_;
      auVar37._8_4_ = auVar106._8_4_ * auVar103._8_4_;
      auVar37._12_4_ = auVar106._12_4_ * auVar103._12_4_;
      auVar37._16_4_ = auVar106._16_4_ * auVar103._16_4_;
      auVar37._20_4_ = auVar106._20_4_ * auVar103._20_4_;
      auVar37._24_4_ = auVar106._24_4_ * auVar103._24_4_;
      auVar37._28_4_ = auVar96._28_4_;
      auVar38._4_4_ = auVar103._4_4_ * -auVar105._4_4_;
      auVar38._0_4_ = auVar103._0_4_ * -auVar105._0_4_;
      auVar38._8_4_ = auVar103._8_4_ * -auVar105._8_4_;
      auVar38._12_4_ = auVar103._12_4_ * -auVar105._12_4_;
      auVar38._16_4_ = auVar103._16_4_ * -auVar105._16_4_;
      auVar38._20_4_ = auVar103._20_4_ * -auVar105._20_4_;
      auVar38._24_4_ = auVar103._24_4_ * -auVar105._24_4_;
      auVar38._28_4_ = auVar105._28_4_ ^ 0x80000000;
      auVar103 = vmulps_avx512vl(auVar103,ZEXT1632(auVar88));
      auVar102 = ZEXT1632(auVar88);
      auVar96 = vfmadd213ps_avx512vl(auVar107,auVar107,auVar102);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar108,auVar108);
      auVar99 = vrsqrt14ps_avx512vl(auVar96);
      auVar96 = vmulps_avx512vl(auVar96,auVar205);
      fVar163 = auVar99._0_4_;
      fVar153 = auVar99._4_4_;
      fVar144 = auVar99._8_4_;
      fVar145 = auVar99._12_4_;
      fVar146 = auVar99._16_4_;
      fVar172 = auVar99._20_4_;
      fVar173 = auVar99._24_4_;
      auVar39._4_4_ = fVar153 * fVar153 * fVar153 * auVar96._4_4_;
      auVar39._0_4_ = fVar163 * fVar163 * fVar163 * auVar96._0_4_;
      auVar39._8_4_ = fVar144 * fVar144 * fVar144 * auVar96._8_4_;
      auVar39._12_4_ = fVar145 * fVar145 * fVar145 * auVar96._12_4_;
      auVar39._16_4_ = fVar146 * fVar146 * fVar146 * auVar96._16_4_;
      auVar39._20_4_ = fVar172 * fVar172 * fVar172 * auVar96._20_4_;
      auVar39._24_4_ = fVar173 * fVar173 * fVar173 * auVar96._24_4_;
      auVar39._28_4_ = 0xbf000000;
      auVar104 = vfmadd231ps_avx512vl(auVar39,auVar104,auVar99);
      auVar40._4_4_ = auVar108._4_4_ * auVar104._4_4_;
      auVar40._0_4_ = auVar108._0_4_ * auVar104._0_4_;
      auVar40._8_4_ = auVar108._8_4_ * auVar104._8_4_;
      auVar40._12_4_ = auVar108._12_4_ * auVar104._12_4_;
      auVar40._16_4_ = auVar108._16_4_ * auVar104._16_4_;
      auVar40._20_4_ = auVar108._20_4_ * auVar104._20_4_;
      auVar40._24_4_ = auVar108._24_4_ * auVar104._24_4_;
      auVar40._28_4_ = auVar99._28_4_;
      auVar41._4_4_ = auVar104._4_4_ * auVar98._4_4_;
      auVar41._0_4_ = auVar104._0_4_ * auVar98._0_4_;
      auVar41._8_4_ = auVar104._8_4_ * auVar98._8_4_;
      auVar41._12_4_ = auVar104._12_4_ * auVar98._12_4_;
      auVar41._16_4_ = auVar104._16_4_ * auVar98._16_4_;
      auVar41._20_4_ = auVar104._20_4_ * auVar98._20_4_;
      auVar41._24_4_ = auVar104._24_4_ * auVar98._24_4_;
      auVar41._28_4_ = auVar96._28_4_;
      auVar98 = vmulps_avx512vl(auVar104,auVar102);
      auVar85 = vfmadd213ps_fma(auVar37,auVar90,ZEXT1632(auVar10));
      auVar86 = vfmadd213ps_fma(auVar38,auVar90,ZEXT1632(auVar11));
      auVar104 = vfmadd213ps_avx512vl(auVar103,auVar90,auVar100);
      auVar99 = vfmadd213ps_avx512vl(auVar40,auVar91,ZEXT1632(auVar12));
      auVar87 = vfnmadd213ps_fma(auVar37,auVar90,ZEXT1632(auVar10));
      auVar6 = vfmadd213ps_fma(auVar41,auVar91,ZEXT1632(auVar147));
      auVar11 = vfnmadd213ps_fma(auVar38,auVar90,ZEXT1632(auVar11));
      auVar7 = vfmadd213ps_fma(auVar98,auVar91,auVar97);
      auVar193 = vfnmadd231ps_fma(auVar100,auVar90,auVar103);
      auVar12 = vfnmadd213ps_fma(auVar40,auVar91,ZEXT1632(auVar12));
      auVar147 = vfnmadd213ps_fma(auVar41,auVar91,ZEXT1632(auVar147));
      auVar195 = vfnmadd231ps_fma(auVar97,auVar91,auVar98);
      auVar97 = vsubps_avx512vl(auVar99,ZEXT1632(auVar87));
      auVar98 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar11));
      auVar96 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar193));
      auVar42._4_4_ = auVar98._4_4_ * auVar193._4_4_;
      auVar42._0_4_ = auVar98._0_4_ * auVar193._0_4_;
      auVar42._8_4_ = auVar98._8_4_ * auVar193._8_4_;
      auVar42._12_4_ = auVar98._12_4_ * auVar193._12_4_;
      auVar42._16_4_ = auVar98._16_4_ * 0.0;
      auVar42._20_4_ = auVar98._20_4_ * 0.0;
      auVar42._24_4_ = auVar98._24_4_ * 0.0;
      auVar42._28_4_ = auVar103._28_4_;
      auVar8 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar11),auVar96);
      auVar43._4_4_ = auVar96._4_4_ * auVar87._4_4_;
      auVar43._0_4_ = auVar96._0_4_ * auVar87._0_4_;
      auVar43._8_4_ = auVar96._8_4_ * auVar87._8_4_;
      auVar43._12_4_ = auVar96._12_4_ * auVar87._12_4_;
      auVar43._16_4_ = auVar96._16_4_ * 0.0;
      auVar43._20_4_ = auVar96._20_4_ * 0.0;
      auVar43._24_4_ = auVar96._24_4_ * 0.0;
      auVar43._28_4_ = auVar96._28_4_;
      auVar9 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar193),auVar97);
      auVar44._4_4_ = auVar11._4_4_ * auVar97._4_4_;
      auVar44._0_4_ = auVar11._0_4_ * auVar97._0_4_;
      auVar44._8_4_ = auVar11._8_4_ * auVar97._8_4_;
      auVar44._12_4_ = auVar11._12_4_ * auVar97._12_4_;
      auVar44._16_4_ = auVar97._16_4_ * 0.0;
      auVar44._20_4_ = auVar97._20_4_ * 0.0;
      auVar44._24_4_ = auVar97._24_4_ * 0.0;
      auVar44._28_4_ = auVar97._28_4_;
      auVar10 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar87),auVar98);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar102,ZEXT1632(auVar9));
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,ZEXT1632(auVar8));
      auVar92 = ZEXT1632(auVar88);
      uVar70 = vcmpps_avx512vl(auVar98,auVar92,2);
      bVar69 = (byte)uVar70;
      fVar83 = (float)((uint)(bVar69 & 1) * auVar85._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar12._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      fVar129 = (float)((uint)bVar15 * auVar85._4_4_ | (uint)!bVar15 * auVar12._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      fVar131 = (float)((uint)bVar15 * auVar85._8_4_ | (uint)!bVar15 * auVar12._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      fVar133 = (float)((uint)bVar15 * auVar85._12_4_ | (uint)!bVar15 * auVar12._12_4_);
      auVar100 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar83))));
      fVar84 = (float)((uint)(bVar69 & 1) * auVar86._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar147._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      fVar130 = (float)((uint)bVar15 * auVar86._4_4_ | (uint)!bVar15 * auVar147._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      fVar132 = (float)((uint)bVar15 * auVar86._8_4_ | (uint)!bVar15 * auVar147._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      fVar134 = (float)((uint)bVar15 * auVar86._12_4_ | (uint)!bVar15 * auVar147._12_4_);
      auVar102 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar84))));
      auVar109._0_4_ =
           (float)((uint)(bVar69 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar195._0_4_)
      ;
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar195._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar195._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar195._12_4_);
      fVar144 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar104._16_4_);
      auVar109._16_4_ = fVar144;
      fVar163 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar104._20_4_);
      auVar109._20_4_ = fVar163;
      fVar153 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar104._24_4_);
      auVar109._24_4_ = fVar153;
      iVar1 = (uint)(byte)(uVar70 >> 7) * auVar104._28_4_;
      auVar109._28_4_ = iVar1;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar87),auVar99);
      auVar110._0_4_ = (uint)(bVar69 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar8._0_4_
      ;
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar8._4_4_;
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar8._8_4_;
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar8._12_4_;
      auVar110._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_;
      auVar110._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_;
      auVar110._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_;
      auVar110._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar11),ZEXT1632(auVar6));
      auVar111._0_4_ =
           (float)((uint)(bVar69 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar85._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar85._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar85._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar85._12_4_);
      fVar172 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_);
      auVar111._16_4_ = fVar172;
      fVar146 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_);
      auVar111._20_4_ = fVar146;
      fVar145 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_);
      auVar111._24_4_ = fVar145;
      auVar111._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
      auVar98 = vblendmps_avx512vl(ZEXT1632(auVar193),ZEXT1632(auVar7));
      auVar112._0_4_ =
           (float)((uint)(bVar69 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar86._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar86._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar86._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar86._12_4_);
      fVar181 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_);
      auVar112._16_4_ = fVar181;
      fVar174 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_);
      auVar112._20_4_ = fVar174;
      fVar173 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_);
      auVar112._24_4_ = fVar173;
      iVar2 = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
      auVar112._28_4_ = iVar2;
      auVar113._0_4_ =
           (uint)(bVar69 & 1) * (int)auVar87._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar99._0_4_;
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar15 * (int)auVar87._4_4_ | (uint)!bVar15 * auVar99._4_4_;
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar15 * (int)auVar87._8_4_ | (uint)!bVar15 * auVar99._8_4_;
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar15 * (int)auVar87._12_4_ | (uint)!bVar15 * auVar99._12_4_;
      auVar113._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar99._16_4_;
      auVar113._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar99._20_4_;
      auVar113._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar99._24_4_;
      auVar113._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar99._28_4_;
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
      bVar19 = (bool)((byte)(uVar70 >> 3) & 1);
      bVar16 = (bool)((byte)(uVar70 >> 1) & 1);
      bVar18 = (bool)((byte)(uVar70 >> 2) & 1);
      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar101 = vsubps_avx512vl(auVar113,auVar100);
      auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar11._12_4_ |
                                              (uint)!bVar19 * auVar6._12_4_,
                                              CONCAT48((uint)bVar17 * (int)auVar11._8_4_ |
                                                       (uint)!bVar17 * auVar6._8_4_,
                                                       CONCAT44((uint)bVar15 * (int)auVar11._4_4_ |
                                                                (uint)!bVar15 * auVar6._4_4_,
                                                                (uint)(bVar69 & 1) *
                                                                (int)auVar11._0_4_ |
                                                                (uint)!(bool)(bVar69 & 1) *
                                                                auVar6._0_4_)))),auVar102);
      auVar187 = ZEXT3264(auVar96);
      auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar193._12_4_ |
                                               (uint)!bVar20 * auVar7._12_4_,
                                               CONCAT48((uint)bVar18 * (int)auVar193._8_4_ |
                                                        (uint)!bVar18 * auVar7._8_4_,
                                                        CONCAT44((uint)bVar16 * (int)auVar193._4_4_
                                                                 | (uint)!bVar16 * auVar7._4_4_,
                                                                 (uint)(bVar69 & 1) *
                                                                 (int)auVar193._0_4_ |
                                                                 (uint)!(bool)(bVar69 & 1) *
                                                                 auVar7._0_4_)))),auVar109);
      auVar103 = vsubps_avx(auVar100,auVar110);
      auVar191 = ZEXT3264(auVar103);
      auVar99 = vsubps_avx(auVar102,auVar111);
      auVar97 = vsubps_avx(auVar109,auVar112);
      auVar45._4_4_ = auVar104._4_4_ * fVar129;
      auVar45._0_4_ = auVar104._0_4_ * fVar83;
      auVar45._8_4_ = auVar104._8_4_ * fVar131;
      auVar45._12_4_ = auVar104._12_4_ * fVar133;
      auVar45._16_4_ = auVar104._16_4_ * 0.0;
      auVar45._20_4_ = auVar104._20_4_ * 0.0;
      auVar45._24_4_ = auVar104._24_4_ * 0.0;
      auVar45._28_4_ = 0;
      auVar85 = vfmsub231ps_fma(auVar45,auVar109,auVar101);
      auVar168._0_4_ = fVar84 * auVar101._0_4_;
      auVar168._4_4_ = fVar130 * auVar101._4_4_;
      auVar168._8_4_ = fVar132 * auVar101._8_4_;
      auVar168._12_4_ = fVar134 * auVar101._12_4_;
      auVar168._16_4_ = auVar101._16_4_ * 0.0;
      auVar168._20_4_ = auVar101._20_4_ * 0.0;
      auVar168._24_4_ = auVar101._24_4_ * 0.0;
      auVar168._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar168,auVar100,auVar96);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar92,ZEXT1632(auVar85));
      auVar176._0_4_ = auVar96._0_4_ * auVar109._0_4_;
      auVar176._4_4_ = auVar96._4_4_ * auVar109._4_4_;
      auVar176._8_4_ = auVar96._8_4_ * auVar109._8_4_;
      auVar176._12_4_ = auVar96._12_4_ * auVar109._12_4_;
      auVar176._16_4_ = auVar96._16_4_ * fVar144;
      auVar176._20_4_ = auVar96._20_4_ * fVar163;
      auVar176._24_4_ = auVar96._24_4_ * fVar153;
      auVar176._28_4_ = 0;
      auVar85 = vfmsub231ps_fma(auVar176,auVar102,auVar104);
      auVar94 = vfmadd231ps_avx512vl(auVar98,auVar92,ZEXT1632(auVar85));
      auVar98 = vmulps_avx512vl(auVar97,auVar110);
      auVar98 = vfmsub231ps_avx512vl(auVar98,auVar103,auVar112);
      auVar46._4_4_ = auVar99._4_4_ * auVar112._4_4_;
      auVar46._0_4_ = auVar99._0_4_ * auVar112._0_4_;
      auVar46._8_4_ = auVar99._8_4_ * auVar112._8_4_;
      auVar46._12_4_ = auVar99._12_4_ * auVar112._12_4_;
      auVar46._16_4_ = auVar99._16_4_ * fVar181;
      auVar46._20_4_ = auVar99._20_4_ * fVar174;
      auVar46._24_4_ = auVar99._24_4_ * fVar173;
      auVar46._28_4_ = iVar2;
      auVar85 = vfmsub231ps_fma(auVar46,auVar111,auVar97);
      auVar177._0_4_ = auVar111._0_4_ * auVar103._0_4_;
      auVar177._4_4_ = auVar111._4_4_ * auVar103._4_4_;
      auVar177._8_4_ = auVar111._8_4_ * auVar103._8_4_;
      auVar177._12_4_ = auVar111._12_4_ * auVar103._12_4_;
      auVar177._16_4_ = fVar172 * auVar103._16_4_;
      auVar177._20_4_ = fVar146 * auVar103._20_4_;
      auVar177._24_4_ = fVar145 * auVar103._24_4_;
      auVar177._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar177,auVar99,auVar110);
      auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar92,auVar98);
      auVar95 = vfmadd231ps_avx512vl(auVar98,auVar92,ZEXT1632(auVar85));
      auVar180 = ZEXT3264(auVar95);
      auVar98 = vmaxps_avx(auVar94,auVar95);
      uVar21 = vcmpps_avx512vl(auVar98,auVar92,2);
      bVar81 = bVar81 & (byte)uVar21;
      if (bVar81 != 0) {
        auVar47._4_4_ = auVar97._4_4_ * auVar96._4_4_;
        auVar47._0_4_ = auVar97._0_4_ * auVar96._0_4_;
        auVar47._8_4_ = auVar97._8_4_ * auVar96._8_4_;
        auVar47._12_4_ = auVar97._12_4_ * auVar96._12_4_;
        auVar47._16_4_ = auVar97._16_4_ * auVar96._16_4_;
        auVar47._20_4_ = auVar97._20_4_ * auVar96._20_4_;
        auVar47._24_4_ = auVar97._24_4_ * auVar96._24_4_;
        auVar47._28_4_ = auVar98._28_4_;
        auVar7 = vfmsub231ps_fma(auVar47,auVar99,auVar104);
        auVar48._4_4_ = auVar104._4_4_ * auVar103._4_4_;
        auVar48._0_4_ = auVar104._0_4_ * auVar103._0_4_;
        auVar48._8_4_ = auVar104._8_4_ * auVar103._8_4_;
        auVar48._12_4_ = auVar104._12_4_ * auVar103._12_4_;
        auVar48._16_4_ = auVar104._16_4_ * auVar103._16_4_;
        auVar48._20_4_ = auVar104._20_4_ * auVar103._20_4_;
        auVar48._24_4_ = auVar104._24_4_ * auVar103._24_4_;
        auVar48._28_4_ = auVar104._28_4_;
        auVar6 = vfmsub231ps_fma(auVar48,auVar101,auVar97);
        auVar49._4_4_ = auVar99._4_4_ * auVar101._4_4_;
        auVar49._0_4_ = auVar99._0_4_ * auVar101._0_4_;
        auVar49._8_4_ = auVar99._8_4_ * auVar101._8_4_;
        auVar49._12_4_ = auVar99._12_4_ * auVar101._12_4_;
        auVar49._16_4_ = auVar99._16_4_ * auVar101._16_4_;
        auVar49._20_4_ = auVar99._20_4_ * auVar101._20_4_;
        auVar49._24_4_ = auVar99._24_4_ * auVar101._24_4_;
        auVar49._28_4_ = auVar99._28_4_;
        auVar8 = vfmsub231ps_fma(auVar49,auVar103,auVar96);
        auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar8));
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar7),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar98 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
        auVar25._8_4_ = 0x3f800000;
        auVar25._0_8_ = 0x3f8000003f800000;
        auVar25._12_4_ = 0x3f800000;
        auVar25._16_4_ = 0x3f800000;
        auVar25._20_4_ = 0x3f800000;
        auVar25._24_4_ = 0x3f800000;
        auVar25._28_4_ = 0x3f800000;
        auVar96 = vfnmadd213ps_avx512vl(auVar98,ZEXT1632(auVar86),auVar25);
        auVar85 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
        auVar187 = ZEXT1664(auVar85);
        auVar50._4_4_ = auVar8._4_4_ * auVar109._4_4_;
        auVar50._0_4_ = auVar8._0_4_ * auVar109._0_4_;
        auVar50._8_4_ = auVar8._8_4_ * auVar109._8_4_;
        auVar50._12_4_ = auVar8._12_4_ * auVar109._12_4_;
        auVar50._16_4_ = fVar144 * 0.0;
        auVar50._20_4_ = fVar163 * 0.0;
        auVar50._24_4_ = fVar153 * 0.0;
        auVar50._28_4_ = iVar1;
        auVar6 = vfmadd231ps_fma(auVar50,auVar102,ZEXT1632(auVar6));
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar100,ZEXT1632(auVar7));
        fVar153 = auVar85._0_4_;
        fVar144 = auVar85._4_4_;
        fVar145 = auVar85._8_4_;
        fVar146 = auVar85._12_4_;
        local_240._28_4_ = auVar98._28_4_;
        local_240._0_28_ =
             ZEXT1628(CONCAT412(auVar6._12_4_ * fVar146,
                                CONCAT48(auVar6._8_4_ * fVar145,
                                         CONCAT44(auVar6._4_4_ * fVar144,auVar6._0_4_ * fVar153))));
        auVar191 = ZEXT3264(local_240);
        auVar137._8_4_ = 3;
        auVar137._0_8_ = 0x300000003;
        auVar137._12_4_ = 3;
        auVar137._16_4_ = 3;
        auVar137._20_4_ = 3;
        auVar137._24_4_ = 3;
        auVar137._28_4_ = 3;
        auVar98 = vpermps_avx2(auVar137,ZEXT1632((undefined1  [16])aVar3));
        uVar21 = vcmpps_avx512vl(auVar98,local_240,2);
        fVar163 = (ray->super_RayK<1>).tfar;
        auVar26._4_4_ = fVar163;
        auVar26._0_4_ = fVar163;
        auVar26._8_4_ = fVar163;
        auVar26._12_4_ = fVar163;
        auVar26._16_4_ = fVar163;
        auVar26._20_4_ = fVar163;
        auVar26._24_4_ = fVar163;
        auVar26._28_4_ = fVar163;
        uVar23 = vcmpps_avx512vl(local_240,auVar26,2);
        bVar81 = (byte)uVar21 & (byte)uVar23 & bVar81;
        if (bVar81 != 0) {
          uVar82 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar82 = bVar81 & uVar82;
          if ((char)uVar82 != '\0') {
            fVar163 = auVar94._0_4_ * fVar153;
            fVar172 = auVar94._4_4_ * fVar144;
            auVar51._4_4_ = fVar172;
            auVar51._0_4_ = fVar163;
            fVar173 = auVar94._8_4_ * fVar145;
            auVar51._8_4_ = fVar173;
            fVar174 = auVar94._12_4_ * fVar146;
            auVar51._12_4_ = fVar174;
            fVar181 = auVar94._16_4_ * 0.0;
            auVar51._16_4_ = fVar181;
            fVar83 = auVar94._20_4_ * 0.0;
            auVar51._20_4_ = fVar83;
            fVar84 = auVar94._24_4_ * 0.0;
            auVar51._24_4_ = fVar84;
            auVar51._28_4_ = auVar94._28_4_;
            auVar138._8_4_ = 0x3f800000;
            auVar138._0_8_ = 0x3f8000003f800000;
            auVar138._12_4_ = 0x3f800000;
            auVar138._16_4_ = 0x3f800000;
            auVar138._20_4_ = 0x3f800000;
            auVar138._24_4_ = 0x3f800000;
            auVar138._28_4_ = 0x3f800000;
            auVar98 = vsubps_avx(auVar138,auVar51);
            local_280._0_4_ =
                 (float)((uint)(bVar69 & 1) * (int)fVar163 |
                        (uint)!(bool)(bVar69 & 1) * auVar98._0_4_);
            bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
            local_280._4_4_ = (float)((uint)bVar15 * (int)fVar172 | (uint)!bVar15 * auVar98._4_4_);
            bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
            local_280._8_4_ = (float)((uint)bVar15 * (int)fVar173 | (uint)!bVar15 * auVar98._8_4_);
            bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
            local_280._12_4_ = (float)((uint)bVar15 * (int)fVar174 | (uint)!bVar15 * auVar98._12_4_)
            ;
            bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
            local_280._16_4_ = (float)((uint)bVar15 * (int)fVar181 | (uint)!bVar15 * auVar98._16_4_)
            ;
            bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
            local_280._20_4_ = (float)((uint)bVar15 * (int)fVar83 | (uint)!bVar15 * auVar98._20_4_);
            bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
            local_280._24_4_ = (float)((uint)bVar15 * (int)fVar84 | (uint)!bVar15 * auVar98._24_4_);
            bVar15 = SUB81(uVar70 >> 7,0);
            local_280._28_4_ =
                 (float)((uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar98._28_4_);
            auVar98 = vsubps_avx(auVar91,auVar90);
            auVar85 = vfmadd213ps_fma(auVar98,local_280,auVar90);
            fVar163 = pre->depth_scale;
            auVar27._4_4_ = fVar163;
            auVar27._0_4_ = fVar163;
            auVar27._8_4_ = fVar163;
            auVar27._12_4_ = fVar163;
            auVar27._16_4_ = fVar163;
            auVar27._20_4_ = fVar163;
            auVar27._24_4_ = fVar163;
            auVar27._28_4_ = fVar163;
            auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                         CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                  CONCAT44(auVar85._4_4_ +
                                                                           auVar85._4_4_,
                                                                           auVar85._0_4_ +
                                                                           auVar85._0_4_)))),auVar27
                                     );
            uVar22 = vcmpps_avx512vl(local_240,auVar98,6);
            uVar82 = uVar82 & uVar22;
            bVar81 = (byte)uVar82;
            if (bVar81 != 0) {
              auVar161._0_4_ = auVar95._0_4_ * fVar153;
              auVar161._4_4_ = auVar95._4_4_ * fVar144;
              auVar161._8_4_ = auVar95._8_4_ * fVar145;
              auVar161._12_4_ = auVar95._12_4_ * fVar146;
              auVar161._16_4_ = auVar95._16_4_ * 0.0;
              auVar161._20_4_ = auVar95._20_4_ * 0.0;
              auVar161._24_4_ = auVar95._24_4_ * 0.0;
              auVar161._28_4_ = 0;
              auVar169._8_4_ = 0x3f800000;
              auVar169._0_8_ = 0x3f8000003f800000;
              auVar169._12_4_ = 0x3f800000;
              auVar169._16_4_ = 0x3f800000;
              auVar169._20_4_ = 0x3f800000;
              auVar169._24_4_ = 0x3f800000;
              auVar169._28_4_ = 0x3f800000;
              auVar98 = vsubps_avx(auVar169,auVar161);
              auVar114._0_4_ =
                   (uint)(bVar69 & 1) * (int)auVar161._0_4_ |
                   (uint)!(bool)(bVar69 & 1) * auVar98._0_4_;
              bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar114._4_4_ = (uint)bVar15 * (int)auVar161._4_4_ | (uint)!bVar15 * auVar98._4_4_;
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar114._8_4_ = (uint)bVar15 * (int)auVar161._8_4_ | (uint)!bVar15 * auVar98._8_4_;
              bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar114._12_4_ = (uint)bVar15 * (int)auVar161._12_4_ | (uint)!bVar15 * auVar98._12_4_
              ;
              bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar114._16_4_ = (uint)bVar15 * (int)auVar161._16_4_ | (uint)!bVar15 * auVar98._16_4_
              ;
              bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar114._20_4_ = (uint)bVar15 * (int)auVar161._20_4_ | (uint)!bVar15 * auVar98._20_4_
              ;
              bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar114._24_4_ = (uint)bVar15 * (int)auVar161._24_4_ | (uint)!bVar15 * auVar98._24_4_
              ;
              auVar114._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar98._28_4_;
              auVar28._8_4_ = 0x40000000;
              auVar28._0_8_ = 0x4000000040000000;
              auVar28._12_4_ = 0x40000000;
              auVar28._16_4_ = 0x40000000;
              auVar28._20_4_ = 0x40000000;
              auVar28._24_4_ = 0x40000000;
              auVar28._28_4_ = 0x40000000;
              local_260 = vfmsub132ps_avx512vl(auVar114,auVar169,auVar28);
              local_220 = 0;
              local_21c = iVar76;
              local_210 = local_4b0._0_8_;
              uStack_208 = local_4b0._8_8_;
              local_200 = local_4d0._0_8_;
              uStack_1f8 = local_4d0._8_8_;
              local_1f0 = local_4e0._0_8_;
              uStack_1e8 = local_4e0._8_8_;
              local_1e0 = local_4c0;
              uStack_1d8 = uStack_4b8;
              if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                local_540 = lVar75;
                fVar163 = 1.0 / auVar201._0_4_;
                local_1c0[0] = fVar163 * (local_280._0_4_ + 0.0);
                local_1c0[1] = fVar163 * (local_280._4_4_ + 1.0);
                local_1c0[2] = fVar163 * (local_280._8_4_ + 2.0);
                local_1c0[3] = fVar163 * (local_280._12_4_ + 3.0);
                fStack_1b0 = fVar163 * (local_280._16_4_ + 4.0);
                fStack_1ac = fVar163 * (local_280._20_4_ + 5.0);
                fStack_1a8 = fVar163 * (local_280._24_4_ + 6.0);
                fStack_1a4 = local_280._28_4_ + 7.0;
                local_1a0 = local_260;
                local_180 = local_240;
                auVar139._8_4_ = 0x7f800000;
                auVar139._0_8_ = 0x7f8000007f800000;
                auVar139._12_4_ = 0x7f800000;
                auVar139._16_4_ = 0x7f800000;
                auVar139._20_4_ = 0x7f800000;
                auVar139._24_4_ = 0x7f800000;
                auVar139._28_4_ = 0x7f800000;
                auVar98 = vblendmps_avx512vl(auVar139,local_240);
                auVar115._0_4_ =
                     (uint)(bVar81 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                bVar15 = (bool)((byte)(uVar82 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar82 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar82 >> 3) & 1);
                auVar115._12_4_ = (uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar82 >> 4) & 1);
                auVar115._16_4_ = (uint)bVar15 * auVar98._16_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar82 >> 5) & 1);
                auVar115._20_4_ = (uint)bVar15 * auVar98._20_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar82 >> 6) & 1);
                auVar115._24_4_ = (uint)bVar15 * auVar98._24_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = SUB81(uVar82 >> 7,0);
                auVar115._28_4_ = (uint)bVar15 * auVar98._28_4_ | (uint)!bVar15 * 0x7f800000;
                auVar98 = vshufps_avx(auVar115,auVar115,0xb1);
                auVar98 = vminps_avx(auVar115,auVar98);
                auVar96 = vshufpd_avx(auVar98,auVar98,5);
                auVar98 = vminps_avx(auVar98,auVar96);
                auVar96 = vpermpd_avx2(auVar98,0x4e);
                auVar98 = vminps_avx(auVar98,auVar96);
                uVar21 = vcmpps_avx512vl(auVar115,auVar98,0);
                uVar71 = (uint)uVar82;
                if ((bVar81 & (byte)uVar21) != 0) {
                  uVar71 = (uint)(bVar81 & (byte)uVar21);
                }
                uVar24 = 0;
                for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                  uVar24 = uVar24 + 1;
                }
                uVar70 = (ulong)uVar24;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_3e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_420 = local_240;
                  local_548 = lVar80;
                  do {
                    local_494 = local_1c0[uVar70];
                    local_490 = *(undefined4 *)(local_1a0 + uVar70 * 4);
                    (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar70 * 4);
                    local_510.context = context->user;
                    fVar153 = 1.0 - local_494;
                    fVar163 = fVar153 * fVar153 * -3.0;
                    auVar180 = ZEXT464((uint)fVar163);
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153)),
                                              ZEXT416((uint)(local_494 * fVar153)),
                                              ZEXT416(0xc0000000));
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar153)),
                                              ZEXT416((uint)(local_494 * local_494)),
                                              ZEXT416(0x40000000));
                    fVar153 = auVar85._0_4_ * 3.0;
                    fVar144 = auVar86._0_4_ * 3.0;
                    fVar145 = local_494 * local_494 * 3.0;
                    auVar185._0_4_ = fVar145 * (float)local_4c0._0_4_;
                    auVar185._4_4_ = fVar145 * (float)local_4c0._4_4_;
                    auVar185._8_4_ = fVar145 * (float)uStack_4b8;
                    auVar185._12_4_ = fVar145 * uStack_4b8._4_4_;
                    auVar187 = ZEXT1664(auVar185);
                    auVar89._4_4_ = fVar144;
                    auVar89._0_4_ = fVar144;
                    auVar89._8_4_ = fVar144;
                    auVar89._12_4_ = fVar144;
                    auVar85 = vfmadd132ps_fma(auVar89,auVar185,local_4e0);
                    auVar167._4_4_ = fVar153;
                    auVar167._0_4_ = fVar153;
                    auVar167._8_4_ = fVar153;
                    auVar167._12_4_ = fVar153;
                    auVar85 = vfmadd132ps_fma(auVar167,auVar85,local_4d0);
                    auVar160._4_4_ = fVar163;
                    auVar160._0_4_ = fVar163;
                    auVar160._8_4_ = fVar163;
                    auVar160._12_4_ = fVar163;
                    auVar85 = vfmadd132ps_fma(auVar160,auVar85,local_4b0);
                    local_4a0 = vmovlps_avx(auVar85);
                    local_498 = vextractps_avx(auVar85,2);
                    local_48c = (int)local_528;
                    local_488 = (int)local_550;
                    local_484 = (local_510.context)->instID[0];
                    local_480 = (local_510.context)->instPrimID[0];
                    local_554 = -1;
                    local_510.valid = &local_554;
                    local_510.geometryUserPtr = pGVar13->userPtr;
                    local_510.ray = (RTCRayN *)ray;
                    local_510.hit = (RTCHitN *)&local_4a0;
                    local_510.N = 1;
                    if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a1abb0:
                      bVar81 = (byte)uVar82;
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar180 = ZEXT1664(auVar180._0_16_);
                        auVar187 = ZEXT1664(auVar187._0_16_);
                        (*p_Var14)(&local_510);
                        auVar191 = ZEXT3264(local_420);
                        auVar208 = ZEXT3264(local_400);
                        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar209 = ZEXT1664(auVar85);
                        auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar207 = ZEXT3264(auVar98);
                        context = local_538;
                        ray = local_530;
                        lVar80 = local_548;
                        if (*local_510.valid == 0) goto LAB_01a1ac73;
                      }
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                           *(float *)local_510.hit;
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_510.hit + 4);
                      (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_510.hit + 8);
                      *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                      *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                      *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                      *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                      *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                      *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                    }
                    else {
                      local_3a0 = (float)uVar82;
                      auVar180 = ZEXT464((uint)fVar163);
                      auVar187 = ZEXT1664(auVar185);
                      (*pGVar13->intersectionFilterN)(&local_510);
                      auVar191 = ZEXT3264(local_420);
                      auVar208 = ZEXT3264(local_400);
                      uVar82 = (ulong)(uint)local_3a0;
                      bVar81 = SUB41(local_3a0,0);
                      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar209 = ZEXT1664(auVar85);
                      auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar207 = ZEXT3264(auVar98);
                      context = local_538;
                      ray = local_530;
                      if (*local_510.valid != 0) goto LAB_01a1abb0;
LAB_01a1ac73:
                      (local_530->super_RayK<1>).tfar = (float)local_3e0._0_4_;
                      context = local_538;
                      ray = local_530;
                    }
                    bVar81 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & bVar81;
                    fVar163 = (ray->super_RayK<1>).tfar;
                    auVar35._4_4_ = fVar163;
                    auVar35._0_4_ = fVar163;
                    auVar35._8_4_ = fVar163;
                    auVar35._12_4_ = fVar163;
                    auVar35._16_4_ = fVar163;
                    auVar35._20_4_ = fVar163;
                    auVar35._24_4_ = fVar163;
                    auVar35._28_4_ = fVar163;
                    uVar21 = vcmpps_avx512vl(auVar191._0_32_,auVar35,2);
                    lVar75 = local_540;
                    pre = local_520;
                    prim = local_518;
                    if ((bVar81 & (byte)uVar21) == 0) goto LAB_01a19da9;
                    local_3e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    bVar81 = bVar81 & (byte)uVar21;
                    uVar82 = (ulong)bVar81;
                    auVar143._8_4_ = 0x7f800000;
                    auVar143._0_8_ = 0x7f8000007f800000;
                    auVar143._12_4_ = 0x7f800000;
                    auVar143._16_4_ = 0x7f800000;
                    auVar143._20_4_ = 0x7f800000;
                    auVar143._24_4_ = 0x7f800000;
                    auVar143._28_4_ = 0x7f800000;
                    auVar98 = vblendmps_avx512vl(auVar143,auVar191._0_32_);
                    auVar128._0_4_ =
                         (uint)(bVar81 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000
                    ;
                    bVar15 = (bool)(bVar81 >> 1 & 1);
                    auVar128._4_4_ = (uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar81 >> 2 & 1);
                    auVar128._8_4_ = (uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar81 >> 3 & 1);
                    auVar128._12_4_ = (uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar81 >> 4 & 1);
                    auVar128._16_4_ = (uint)bVar15 * auVar98._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar81 >> 5 & 1);
                    auVar128._20_4_ = (uint)bVar15 * auVar98._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar81 >> 6 & 1);
                    auVar128._24_4_ = (uint)bVar15 * auVar98._24_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar128._28_4_ =
                         (uint)(bVar81 >> 7) * auVar98._28_4_ |
                         (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                    auVar98 = vshufps_avx(auVar128,auVar128,0xb1);
                    auVar98 = vminps_avx(auVar128,auVar98);
                    auVar96 = vshufpd_avx(auVar98,auVar98,5);
                    auVar98 = vminps_avx(auVar98,auVar96);
                    auVar96 = vpermpd_avx2(auVar98,0x4e);
                    auVar98 = vminps_avx(auVar98,auVar96);
                    uVar21 = vcmpps_avx512vl(auVar128,auVar98,0);
                    bVar69 = (byte)uVar21 & bVar81;
                    if (bVar69 != 0) {
                      bVar81 = bVar69;
                    }
                    uVar72 = 0;
                    for (uVar73 = (uint)bVar81; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000
                        ) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar70 = (ulong)uVar72;
                  } while( true );
                }
                fVar163 = local_1c0[uVar70];
                fVar153 = *(float *)(local_1a0 + uVar70 * 4);
                fVar145 = 1.0 - fVar163;
                fVar144 = fVar145 * fVar145 * -3.0;
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),
                                          ZEXT416((uint)(fVar163 * fVar145)),ZEXT416(0xc0000000));
                auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar145)),
                                          ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000));
                fVar145 = auVar85._0_4_ * 3.0;
                fVar146 = auVar86._0_4_ * 3.0;
                fVar172 = fVar163 * fVar163 * 3.0;
                auVar182._0_4_ = fVar172 * (float)local_4c0._0_4_;
                auVar182._4_4_ = fVar172 * (float)local_4c0._4_4_;
                auVar182._8_4_ = fVar172 * (float)uStack_4b8;
                auVar182._12_4_ = fVar172 * uStack_4b8._4_4_;
                auVar187 = ZEXT1664(auVar182);
                auVar154._4_4_ = fVar146;
                auVar154._0_4_ = fVar146;
                auVar154._8_4_ = fVar146;
                auVar154._12_4_ = fVar146;
                auVar85 = vfmadd132ps_fma(auVar154,auVar182,local_4e0);
                auVar164._4_4_ = fVar145;
                auVar164._0_4_ = fVar145;
                auVar164._8_4_ = fVar145;
                auVar164._12_4_ = fVar145;
                auVar85 = vfmadd132ps_fma(auVar164,auVar85,local_4d0);
                auVar155._4_4_ = fVar144;
                auVar155._0_4_ = fVar144;
                auVar155._8_4_ = fVar144;
                auVar155._12_4_ = fVar144;
                auVar180 = ZEXT464((uint)*(float *)(local_180 + uVar70 * 4));
                (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar70 * 4);
                auVar85 = vfmadd132ps_fma(auVar155,auVar85,local_4b0);
                uVar21 = vmovlps_avx(auVar85);
                *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                fVar144 = (float)vextractps_avx(auVar85,2);
                (ray->Ng).field_0.field_0.z = fVar144;
                ray->u = fVar163;
                ray->v = fVar153;
                ray->primID = uVar73;
                ray->geomID = uVar72;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                lVar75 = local_540;
                pre = local_520;
                prim = local_518;
              }
            }
          }
        }
      }
    }
LAB_01a19da9:
    if (8 < iVar76) {
      auVar98 = vpbroadcastd_avx512vl();
      auVar210 = ZEXT3264(auVar98);
      local_3e0._4_4_ = local_440._0_4_;
      local_3e0._0_4_ = local_440._0_4_;
      local_3e0._8_4_ = local_440._0_4_;
      local_3e0._12_4_ = local_440._0_4_;
      local_3e0._16_4_ = local_440._0_4_;
      local_3e0._20_4_ = local_440._0_4_;
      local_3e0._24_4_ = local_440._0_4_;
      local_3e0._28_4_ = local_440._0_4_;
      auVar140._8_4_ = 3;
      auVar140._0_8_ = 0x300000003;
      auVar140._12_4_ = 3;
      auVar140._16_4_ = 3;
      auVar140._20_4_ = 3;
      auVar140._24_4_ = 3;
      auVar140._28_4_ = 3;
      local_3c0 = vpermps_avx2(auVar140,local_3c0);
      local_3a0 = 1.0 / (float)local_460._0_4_;
      fStack_39c = local_3a0;
      fStack_398 = local_3a0;
      fStack_394 = local_3a0;
      fStack_390 = local_3a0;
      fStack_38c = local_3a0;
      fStack_388 = local_3a0;
      fStack_384 = local_3a0;
      lVar78 = 8;
      local_548 = lVar80;
LAB_01a19e33:
      if (lVar78 < lVar75) {
        auVar98 = vpbroadcastd_avx512vl();
        auVar98 = vpor_avx2(auVar98,_DAT_01fb4ba0);
        uVar23 = vpcmpgtd_avx512vl(auVar210._0_32_,auVar98);
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 * 4 + lVar80);
        auVar96 = *(undefined1 (*) [32])(lVar80 + 0x21fb768 + lVar78 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar80 + 0x21fbbec + lVar78 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar80 + 0x21fc070 + lVar78 * 4);
        auVar188._0_4_ = auVar103._0_4_ * (float)local_360._0_4_;
        auVar188._4_4_ = auVar103._4_4_ * (float)local_360._4_4_;
        auVar188._8_4_ = auVar103._8_4_ * fStack_358;
        auVar188._12_4_ = auVar103._12_4_ * fStack_354;
        auVar188._16_4_ = auVar103._16_4_ * fStack_350;
        auVar188._20_4_ = auVar103._20_4_ * fStack_34c;
        auVar188._28_36_ = auVar187._28_36_;
        auVar188._24_4_ = auVar103._24_4_ * fStack_348;
        auVar187._0_4_ = auVar103._0_4_ * (float)local_380._0_4_;
        auVar187._4_4_ = auVar103._4_4_ * (float)local_380._4_4_;
        auVar187._8_4_ = auVar103._8_4_ * fStack_378;
        auVar187._12_4_ = auVar103._12_4_ * fStack_374;
        auVar187._16_4_ = auVar103._16_4_ * fStack_370;
        auVar187._20_4_ = auVar103._20_4_ * fStack_36c;
        auVar187._28_36_ = auVar180._28_36_;
        auVar187._24_4_ = auVar103._24_4_ * fStack_368;
        auVar99 = vmulps_avx512vl(local_e0,auVar103);
        auVar97 = vfmadd231ps_avx512vl(auVar188._0_32_,auVar104,local_320);
        auVar100 = vfmadd231ps_avx512vl(auVar187._0_32_,auVar104,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar96,local_2e0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,local_300);
        auVar102 = vfmadd231ps_avx512vl(auVar99,auVar96,local_a0);
        auVar85 = vfmadd231ps_fma(auVar97,auVar98,local_2a0);
        auVar187 = ZEXT1664(auVar85);
        auVar86 = vfmadd231ps_fma(auVar100,auVar98,local_2c0);
        auVar180 = ZEXT1664(auVar86);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 * 4 + lVar80);
        auVar97 = *(undefined1 (*) [32])(lVar80 + 0x21fdb88 + lVar78 * 4);
        auVar95 = vfmadd231ps_avx512vl(auVar102,auVar98,local_100);
        auVar100 = *(undefined1 (*) [32])(lVar80 + 0x21fe00c + lVar78 * 4);
        auVar102 = *(undefined1 (*) [32])(lVar80 + 0x21fe490 + lVar78 * 4);
        auVar192._0_4_ = auVar102._0_4_ * (float)local_360._0_4_;
        auVar192._4_4_ = auVar102._4_4_ * (float)local_360._4_4_;
        auVar192._8_4_ = auVar102._8_4_ * fStack_358;
        auVar192._12_4_ = auVar102._12_4_ * fStack_354;
        auVar192._16_4_ = auVar102._16_4_ * fStack_350;
        auVar192._20_4_ = auVar102._20_4_ * fStack_34c;
        auVar192._28_36_ = auVar191._28_36_;
        auVar192._24_4_ = auVar102._24_4_ * fStack_348;
        auVar52._4_4_ = auVar102._4_4_ * (float)local_380._4_4_;
        auVar52._0_4_ = auVar102._0_4_ * (float)local_380._0_4_;
        auVar52._8_4_ = auVar102._8_4_ * fStack_378;
        auVar52._12_4_ = auVar102._12_4_ * fStack_374;
        auVar52._16_4_ = auVar102._16_4_ * fStack_370;
        auVar52._20_4_ = auVar102._20_4_ * fStack_36c;
        auVar52._24_4_ = auVar102._24_4_ * fStack_368;
        auVar52._28_4_ = uStack_364;
        auVar101 = vmulps_avx512vl(local_e0,auVar102);
        auVar94 = vfmadd231ps_avx512vl(auVar192._0_32_,auVar100,local_320);
        auVar90 = vfmadd231ps_avx512vl(auVar52,auVar100,local_340);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,local_c0);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,local_2e0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,local_300);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_a0);
        auVar6 = vfmadd231ps_fma(auVar94,auVar99,local_2a0);
        auVar191 = ZEXT1664(auVar6);
        auVar7 = vfmadd231ps_fma(auVar90,auVar99,local_2c0);
        auVar90 = vfmadd231ps_avx512vl(auVar101,auVar99,local_100);
        auVar91 = vmaxps_avx512vl(auVar95,auVar90);
        auVar101 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar85));
        auVar94 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar86));
        auVar92 = vmulps_avx512vl(ZEXT1632(auVar86),auVar101);
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar85),auVar94);
        auVar92 = vsubps_avx512vl(auVar92,auVar93);
        auVar93 = vmulps_avx512vl(auVar94,auVar94);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar101,auVar101);
        auVar91 = vmulps_avx512vl(auVar91,auVar91);
        auVar91 = vmulps_avx512vl(auVar91,auVar93);
        auVar92 = vmulps_avx512vl(auVar92,auVar92);
        uVar21 = vcmpps_avx512vl(auVar92,auVar91,2);
        bVar81 = (byte)uVar23 & (byte)uVar21;
        if (bVar81 != 0) {
          in_ZMM25 = ZEXT3264(local_160);
          auVar102 = vmulps_avx512vl(local_160,auVar102);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar102);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar100);
          local_400 = auVar208._0_32_;
          auVar99 = vfmadd213ps_avx512vl(auVar99,local_400,auVar97);
          auVar103 = vmulps_avx512vl(local_160,auVar103);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_140,auVar103);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_120,auVar104);
          auVar97 = vfmadd213ps_avx512vl(auVar98,local_400,auVar96);
          auVar98 = *(undefined1 (*) [32])(lVar80 + 0x21fc4f4 + lVar78 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar80 + 0x21fc978 + lVar78 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar80 + 0x21fcdfc + lVar78 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar80 + 0x21fd280 + lVar78 * 4);
          auVar100 = vmulps_avx512vl(_local_360,auVar103);
          auVar102 = vmulps_avx512vl(_local_380,auVar103);
          auVar103 = vmulps_avx512vl(local_160,auVar103);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar104,local_320);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,local_340);
          auVar104 = vfmadd231ps_avx512vl(auVar103,local_140,auVar104);
          auVar103 = vfmadd231ps_avx512vl(auVar100,auVar96,local_2e0);
          auVar100 = vfmadd231ps_avx512vl(auVar102,auVar96,local_300);
          auVar96 = vfmadd231ps_avx512vl(auVar104,local_120,auVar96);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar98,local_2a0);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar98,local_2c0);
          auVar102 = vfmadd231ps_avx512vl(auVar96,local_400,auVar98);
          auVar98 = *(undefined1 (*) [32])(lVar80 + 0x21fe914 + lVar78 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar80 + 0x21ff21c + lVar78 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar80 + 0x21ff6a0 + lVar78 * 4);
          auVar91 = vmulps_avx512vl(_local_360,auVar104);
          auVar92 = vmulps_avx512vl(_local_380,auVar104);
          auVar104 = vmulps_avx512vl(local_160,auVar104);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_320);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,local_340);
          auVar104 = vfmadd231ps_avx512vl(auVar104,local_140,auVar96);
          auVar96 = *(undefined1 (*) [32])(lVar80 + 0x21fed98 + lVar78 * 4);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_2e0);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar96,local_300);
          auVar96 = vfmadd231ps_avx512vl(auVar104,local_120,auVar96);
          auVar104 = vfmadd231ps_avx512vl(auVar91,auVar98,local_2a0);
          auVar91 = vfmadd231ps_avx512vl(auVar92,auVar98,local_2c0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,local_400,auVar98);
          auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar103,auVar92);
          vandps_avx512vl(auVar100,auVar92);
          auVar98 = vmaxps_avx(auVar92,auVar92);
          vandps_avx512vl(auVar102,auVar92);
          auVar98 = vmaxps_avx(auVar98,auVar92);
          uVar70 = vcmpps_avx512vl(auVar98,local_3e0,1);
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar116._0_4_ = (float)((uint)bVar15 * auVar101._0_4_ | (uint)!bVar15 * auVar103._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar15 * auVar101._4_4_ | (uint)!bVar15 * auVar103._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar15 * auVar101._8_4_ | (uint)!bVar15 * auVar103._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar116._12_4_ =
               (float)((uint)bVar15 * auVar101._12_4_ | (uint)!bVar15 * auVar103._12_4_);
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar116._16_4_ =
               (float)((uint)bVar15 * auVar101._16_4_ | (uint)!bVar15 * auVar103._16_4_);
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar116._20_4_ =
               (float)((uint)bVar15 * auVar101._20_4_ | (uint)!bVar15 * auVar103._20_4_);
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar116._24_4_ =
               (float)((uint)bVar15 * auVar101._24_4_ | (uint)!bVar15 * auVar103._24_4_);
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar116._28_4_ = (uint)bVar15 * auVar101._28_4_ | (uint)!bVar15 * auVar103._28_4_;
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar117._0_4_ = (float)((uint)bVar15 * auVar94._0_4_ | (uint)!bVar15 * auVar100._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar100._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar100._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar100._12_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * auVar100._16_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * auVar100._20_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * auVar100._24_4_)
          ;
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar117._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar100._28_4_;
          vandps_avx512vl(auVar104,auVar92);
          vandps_avx512vl(auVar91,auVar92);
          auVar98 = vmaxps_avx(auVar117,auVar117);
          vandps_avx512vl(auVar96,auVar92);
          auVar98 = vmaxps_avx(auVar98,auVar117);
          uVar70 = vcmpps_avx512vl(auVar98,local_3e0,1);
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar118._0_4_ = (uint)bVar15 * auVar101._0_4_ | (uint)!bVar15 * auVar104._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar118._4_4_ = (uint)bVar15 * auVar101._4_4_ | (uint)!bVar15 * auVar104._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar118._8_4_ = (uint)bVar15 * auVar101._8_4_ | (uint)!bVar15 * auVar104._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar118._12_4_ = (uint)bVar15 * auVar101._12_4_ | (uint)!bVar15 * auVar104._12_4_;
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar118._16_4_ = (uint)bVar15 * auVar101._16_4_ | (uint)!bVar15 * auVar104._16_4_;
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar118._20_4_ = (uint)bVar15 * auVar101._20_4_ | (uint)!bVar15 * auVar104._20_4_;
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar118._24_4_ = (uint)bVar15 * auVar101._24_4_ | (uint)!bVar15 * auVar104._24_4_;
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar118._28_4_ = (uint)bVar15 * auVar101._28_4_ | (uint)!bVar15 * auVar104._28_4_;
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar119._0_4_ = (float)((uint)bVar15 * auVar94._0_4_ | (uint)!bVar15 * auVar91._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar91._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar91._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar91._12_4_);
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * auVar91._16_4_);
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * auVar91._20_4_);
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * auVar91._24_4_);
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar119._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar91._28_4_;
          auVar197._8_4_ = 0x80000000;
          auVar197._0_8_ = 0x8000000080000000;
          auVar197._12_4_ = 0x80000000;
          auVar197._16_4_ = 0x80000000;
          auVar197._20_4_ = 0x80000000;
          auVar197._24_4_ = 0x80000000;
          auVar197._28_4_ = 0x80000000;
          auVar98 = vxorps_avx512vl(auVar118,auVar197);
          auVar89 = vxorps_avx512vl(auVar92._0_16_,auVar92._0_16_);
          auVar96 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar89));
          auVar8 = vfmadd231ps_fma(auVar96,auVar117,auVar117);
          auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar8));
          auVar206._8_4_ = 0xbf000000;
          auVar206._0_8_ = 0xbf000000bf000000;
          auVar206._12_4_ = 0xbf000000;
          auVar206._16_4_ = 0xbf000000;
          auVar206._20_4_ = 0xbf000000;
          auVar206._24_4_ = 0xbf000000;
          auVar206._28_4_ = 0xbf000000;
          fVar163 = auVar96._0_4_;
          fVar153 = auVar96._4_4_;
          fVar144 = auVar96._8_4_;
          fVar145 = auVar96._12_4_;
          fVar146 = auVar96._16_4_;
          fVar172 = auVar96._20_4_;
          fVar173 = auVar96._24_4_;
          auVar53._4_4_ = fVar153 * fVar153 * fVar153 * auVar8._4_4_ * -0.5;
          auVar53._0_4_ = fVar163 * fVar163 * fVar163 * auVar8._0_4_ * -0.5;
          auVar53._8_4_ = fVar144 * fVar144 * fVar144 * auVar8._8_4_ * -0.5;
          auVar53._12_4_ = fVar145 * fVar145 * fVar145 * auVar8._12_4_ * -0.5;
          auVar53._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
          auVar53._20_4_ = fVar172 * fVar172 * fVar172 * -0.0;
          auVar53._24_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar53._28_4_ = auVar117._28_4_;
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar96 = vfmadd231ps_avx512vl(auVar53,auVar104,auVar96);
          auVar54._4_4_ = auVar117._4_4_ * auVar96._4_4_;
          auVar54._0_4_ = auVar117._0_4_ * auVar96._0_4_;
          auVar54._8_4_ = auVar117._8_4_ * auVar96._8_4_;
          auVar54._12_4_ = auVar117._12_4_ * auVar96._12_4_;
          auVar54._16_4_ = auVar117._16_4_ * auVar96._16_4_;
          auVar54._20_4_ = auVar117._20_4_ * auVar96._20_4_;
          auVar54._24_4_ = auVar117._24_4_ * auVar96._24_4_;
          auVar54._28_4_ = 0;
          auVar55._4_4_ = auVar96._4_4_ * -auVar116._4_4_;
          auVar55._0_4_ = auVar96._0_4_ * -auVar116._0_4_;
          auVar55._8_4_ = auVar96._8_4_ * -auVar116._8_4_;
          auVar55._12_4_ = auVar96._12_4_ * -auVar116._12_4_;
          auVar55._16_4_ = auVar96._16_4_ * -auVar116._16_4_;
          auVar55._20_4_ = auVar96._20_4_ * -auVar116._20_4_;
          auVar55._24_4_ = auVar96._24_4_ * -auVar116._24_4_;
          auVar55._28_4_ = auVar117._28_4_;
          auVar103 = vmulps_avx512vl(auVar96,ZEXT1632(auVar89));
          auVar102 = ZEXT1632(auVar89);
          auVar96 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar102);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar119,auVar119);
          auVar100 = vrsqrt14ps_avx512vl(auVar96);
          auVar96 = vmulps_avx512vl(auVar96,auVar206);
          fVar163 = auVar100._0_4_;
          fVar153 = auVar100._4_4_;
          fVar144 = auVar100._8_4_;
          fVar145 = auVar100._12_4_;
          fVar146 = auVar100._16_4_;
          fVar172 = auVar100._20_4_;
          fVar173 = auVar100._24_4_;
          auVar56._4_4_ = fVar153 * fVar153 * fVar153 * auVar96._4_4_;
          auVar56._0_4_ = fVar163 * fVar163 * fVar163 * auVar96._0_4_;
          auVar56._8_4_ = fVar144 * fVar144 * fVar144 * auVar96._8_4_;
          auVar56._12_4_ = fVar145 * fVar145 * fVar145 * auVar96._12_4_;
          auVar56._16_4_ = fVar146 * fVar146 * fVar146 * auVar96._16_4_;
          auVar56._20_4_ = fVar172 * fVar172 * fVar172 * auVar96._20_4_;
          auVar56._24_4_ = fVar173 * fVar173 * fVar173 * auVar96._24_4_;
          auVar56._28_4_ = auVar96._28_4_;
          auVar96 = vfmadd231ps_avx512vl(auVar56,auVar104,auVar100);
          auVar57._4_4_ = auVar119._4_4_ * auVar96._4_4_;
          auVar57._0_4_ = auVar119._0_4_ * auVar96._0_4_;
          auVar57._8_4_ = auVar119._8_4_ * auVar96._8_4_;
          auVar57._12_4_ = auVar119._12_4_ * auVar96._12_4_;
          auVar57._16_4_ = auVar119._16_4_ * auVar96._16_4_;
          auVar57._20_4_ = auVar119._20_4_ * auVar96._20_4_;
          auVar57._24_4_ = auVar119._24_4_ * auVar96._24_4_;
          auVar57._28_4_ = auVar100._28_4_;
          auVar58._4_4_ = auVar96._4_4_ * auVar98._4_4_;
          auVar58._0_4_ = auVar96._0_4_ * auVar98._0_4_;
          auVar58._8_4_ = auVar96._8_4_ * auVar98._8_4_;
          auVar58._12_4_ = auVar96._12_4_ * auVar98._12_4_;
          auVar58._16_4_ = auVar96._16_4_ * auVar98._16_4_;
          auVar58._20_4_ = auVar96._20_4_ * auVar98._20_4_;
          auVar58._24_4_ = auVar96._24_4_ * auVar98._24_4_;
          auVar58._28_4_ = auVar98._28_4_;
          auVar98 = vmulps_avx512vl(auVar96,auVar102);
          auVar8 = vfmadd213ps_fma(auVar54,auVar95,ZEXT1632(auVar85));
          auVar9 = vfmadd213ps_fma(auVar55,auVar95,ZEXT1632(auVar86));
          auVar104 = vfmadd213ps_avx512vl(auVar103,auVar95,auVar97);
          auVar100 = vfmadd213ps_avx512vl(auVar57,auVar90,ZEXT1632(auVar6));
          auVar11 = vfnmadd213ps_fma(auVar54,auVar95,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar58,auVar90,ZEXT1632(auVar7));
          auVar12 = vfnmadd213ps_fma(auVar55,auVar95,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar98,auVar90,auVar99);
          auVar149 = vfnmadd231ps_fma(auVar97,auVar95,auVar103);
          auVar147 = vfnmadd213ps_fma(auVar57,auVar90,ZEXT1632(auVar6));
          auVar148 = vfnmadd213ps_fma(auVar58,auVar90,ZEXT1632(auVar7));
          auVar150 = vfnmadd231ps_fma(auVar99,auVar90,auVar98);
          auVar99 = vsubps_avx512vl(auVar100,ZEXT1632(auVar11));
          auVar98 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar12));
          auVar96 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar149));
          auVar59._4_4_ = auVar98._4_4_ * auVar149._4_4_;
          auVar59._0_4_ = auVar98._0_4_ * auVar149._0_4_;
          auVar59._8_4_ = auVar98._8_4_ * auVar149._8_4_;
          auVar59._12_4_ = auVar98._12_4_ * auVar149._12_4_;
          auVar59._16_4_ = auVar98._16_4_ * 0.0;
          auVar59._20_4_ = auVar98._20_4_ * 0.0;
          auVar59._24_4_ = auVar98._24_4_ * 0.0;
          auVar59._28_4_ = auVar103._28_4_;
          auVar6 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar12),auVar96);
          auVar60._4_4_ = auVar96._4_4_ * auVar11._4_4_;
          auVar60._0_4_ = auVar96._0_4_ * auVar11._0_4_;
          auVar60._8_4_ = auVar96._8_4_ * auVar11._8_4_;
          auVar60._12_4_ = auVar96._12_4_ * auVar11._12_4_;
          auVar60._16_4_ = auVar96._16_4_ * 0.0;
          auVar60._20_4_ = auVar96._20_4_ * 0.0;
          auVar60._24_4_ = auVar96._24_4_ * 0.0;
          auVar60._28_4_ = auVar96._28_4_;
          auVar7 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar149),auVar99);
          auVar61._4_4_ = auVar12._4_4_ * auVar99._4_4_;
          auVar61._0_4_ = auVar12._0_4_ * auVar99._0_4_;
          auVar61._8_4_ = auVar12._8_4_ * auVar99._8_4_;
          auVar61._12_4_ = auVar12._12_4_ * auVar99._12_4_;
          auVar61._16_4_ = auVar99._16_4_ * 0.0;
          auVar61._20_4_ = auVar99._20_4_ * 0.0;
          auVar61._24_4_ = auVar99._24_4_ * 0.0;
          auVar61._28_4_ = auVar99._28_4_;
          auVar10 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar11),auVar98);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar10),auVar102,ZEXT1632(auVar7));
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,ZEXT1632(auVar6));
          auVar92 = ZEXT1632(auVar89);
          uVar70 = vcmpps_avx512vl(auVar98,auVar92,2);
          bVar69 = (byte)uVar70;
          fVar83 = (float)((uint)(bVar69 & 1) * auVar8._0_4_ |
                          (uint)!(bool)(bVar69 & 1) * auVar147._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar129 = (float)((uint)bVar15 * auVar8._4_4_ | (uint)!bVar15 * auVar147._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar131 = (float)((uint)bVar15 * auVar8._8_4_ | (uint)!bVar15 * auVar147._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar133 = (float)((uint)bVar15 * auVar8._12_4_ | (uint)!bVar15 * auVar147._12_4_);
          auVar102 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar83))));
          fVar84 = (float)((uint)(bVar69 & 1) * auVar9._0_4_ |
                          (uint)!(bool)(bVar69 & 1) * auVar148._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar130 = (float)((uint)bVar15 * auVar9._4_4_ | (uint)!bVar15 * auVar148._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar132 = (float)((uint)bVar15 * auVar9._8_4_ | (uint)!bVar15 * auVar148._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar134 = (float)((uint)bVar15 * auVar9._12_4_ | (uint)!bVar15 * auVar148._12_4_);
          auVar101 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar84))));
          auVar120._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar104._0_4_ |
                      (uint)!(bool)(bVar69 & 1) * auVar150._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar15 * auVar104._4_4_ | (uint)!bVar15 * auVar150._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar15 * auVar104._8_4_ | (uint)!bVar15 * auVar150._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar120._12_4_ =
               (float)((uint)bVar15 * auVar104._12_4_ | (uint)!bVar15 * auVar150._12_4_);
          fVar144 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar104._16_4_);
          auVar120._16_4_ = fVar144;
          fVar163 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar104._20_4_);
          auVar120._20_4_ = fVar163;
          fVar153 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar104._24_4_);
          auVar120._24_4_ = fVar153;
          iVar1 = (uint)(byte)(uVar70 >> 7) * auVar104._28_4_;
          auVar120._28_4_ = iVar1;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar11),auVar100);
          auVar121._0_4_ =
               (uint)(bVar69 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar6._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar6._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar6._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar6._12_4_;
          auVar121._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_;
          auVar121._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_;
          auVar121._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_;
          auVar121._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar12),ZEXT1632(auVar85));
          auVar122._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar8._0_4_
                      );
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar8._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar8._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar8._12_4_);
          fVar145 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_);
          auVar122._16_4_ = fVar145;
          fVar146 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_);
          auVar122._20_4_ = fVar146;
          fVar172 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_);
          auVar122._24_4_ = fVar172;
          auVar122._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
          auVar98 = vblendmps_avx512vl(ZEXT1632(auVar149),ZEXT1632(auVar86));
          auVar123._0_4_ =
               (float)((uint)(bVar69 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar9._0_4_
                      );
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar9._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar9._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar9._12_4_);
          fVar174 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_);
          auVar123._16_4_ = fVar174;
          fVar181 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_);
          auVar123._20_4_ = fVar181;
          fVar173 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_);
          auVar123._24_4_ = fVar173;
          iVar2 = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
          auVar123._28_4_ = iVar2;
          auVar124._0_4_ =
               (uint)(bVar69 & 1) * (int)auVar11._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar100._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar15 * (int)auVar11._4_4_ | (uint)!bVar15 * auVar100._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar15 * (int)auVar11._8_4_ | (uint)!bVar15 * auVar100._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar15 * (int)auVar11._12_4_ | (uint)!bVar15 * auVar100._12_4_;
          auVar124._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar100._16_4_;
          auVar124._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar100._20_4_;
          auVar124._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar100._24_4_;
          auVar124._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar100._28_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar100 = vsubps_avx512vl(auVar124,auVar102);
          auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar12._12_4_ |
                                                  (uint)!bVar19 * auVar85._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar12._8_4_ |
                                                           (uint)!bVar17 * auVar85._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar12._4_4_ |
                                                                    (uint)!bVar15 * auVar85._4_4_,
                                                                    (uint)(bVar69 & 1) *
                                                                    (int)auVar12._0_4_ |
                                                                    (uint)!(bool)(bVar69 & 1) *
                                                                    auVar85._0_4_)))),auVar101);
          auVar187 = ZEXT3264(auVar96);
          auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar149._12_4_ |
                                                   (uint)!bVar20 * auVar86._12_4_,
                                                   CONCAT48((uint)bVar18 * (int)auVar149._8_4_ |
                                                            (uint)!bVar18 * auVar86._8_4_,
                                                            CONCAT44((uint)bVar16 *
                                                                     (int)auVar149._4_4_ |
                                                                     (uint)!bVar16 * auVar86._4_4_,
                                                                     (uint)(bVar69 & 1) *
                                                                     (int)auVar149._0_4_ |
                                                                     (uint)!(bool)(bVar69 & 1) *
                                                                     auVar86._0_4_)))),auVar120);
          auVar103 = vsubps_avx(auVar102,auVar121);
          auVar191 = ZEXT3264(auVar103);
          auVar99 = vsubps_avx(auVar101,auVar122);
          auVar97 = vsubps_avx(auVar120,auVar123);
          auVar62._4_4_ = auVar104._4_4_ * fVar129;
          auVar62._0_4_ = auVar104._0_4_ * fVar83;
          auVar62._8_4_ = auVar104._8_4_ * fVar131;
          auVar62._12_4_ = auVar104._12_4_ * fVar133;
          auVar62._16_4_ = auVar104._16_4_ * 0.0;
          auVar62._20_4_ = auVar104._20_4_ * 0.0;
          auVar62._24_4_ = auVar104._24_4_ * 0.0;
          auVar62._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar62,auVar120,auVar100);
          auVar170._0_4_ = fVar84 * auVar100._0_4_;
          auVar170._4_4_ = fVar130 * auVar100._4_4_;
          auVar170._8_4_ = fVar132 * auVar100._8_4_;
          auVar170._12_4_ = fVar134 * auVar100._12_4_;
          auVar170._16_4_ = auVar100._16_4_ * 0.0;
          auVar170._20_4_ = auVar100._20_4_ * 0.0;
          auVar170._24_4_ = auVar100._24_4_ * 0.0;
          auVar170._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar170,auVar102,auVar96);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar92,ZEXT1632(auVar85));
          auVar178._0_4_ = auVar96._0_4_ * auVar120._0_4_;
          auVar178._4_4_ = auVar96._4_4_ * auVar120._4_4_;
          auVar178._8_4_ = auVar96._8_4_ * auVar120._8_4_;
          auVar178._12_4_ = auVar96._12_4_ * auVar120._12_4_;
          auVar178._16_4_ = auVar96._16_4_ * fVar144;
          auVar178._20_4_ = auVar96._20_4_ * fVar163;
          auVar178._24_4_ = auVar96._24_4_ * fVar153;
          auVar178._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar178,auVar101,auVar104);
          auVar94 = vfmadd231ps_avx512vl(auVar98,auVar92,ZEXT1632(auVar85));
          auVar98 = vmulps_avx512vl(auVar97,auVar121);
          auVar98 = vfmsub231ps_avx512vl(auVar98,auVar103,auVar123);
          auVar63._4_4_ = auVar99._4_4_ * auVar123._4_4_;
          auVar63._0_4_ = auVar99._0_4_ * auVar123._0_4_;
          auVar63._8_4_ = auVar99._8_4_ * auVar123._8_4_;
          auVar63._12_4_ = auVar99._12_4_ * auVar123._12_4_;
          auVar63._16_4_ = auVar99._16_4_ * fVar174;
          auVar63._20_4_ = auVar99._20_4_ * fVar181;
          auVar63._24_4_ = auVar99._24_4_ * fVar173;
          auVar63._28_4_ = iVar2;
          auVar85 = vfmsub231ps_fma(auVar63,auVar122,auVar97);
          auVar179._0_4_ = auVar122._0_4_ * auVar103._0_4_;
          auVar179._4_4_ = auVar122._4_4_ * auVar103._4_4_;
          auVar179._8_4_ = auVar122._8_4_ * auVar103._8_4_;
          auVar179._12_4_ = auVar122._12_4_ * auVar103._12_4_;
          auVar179._16_4_ = fVar145 * auVar103._16_4_;
          auVar179._20_4_ = fVar146 * auVar103._20_4_;
          auVar179._24_4_ = fVar172 * auVar103._24_4_;
          auVar179._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar179,auVar99,auVar121);
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar92,auVar98);
          auVar91 = vfmadd231ps_avx512vl(auVar98,auVar92,ZEXT1632(auVar85));
          auVar180 = ZEXT3264(auVar91);
          auVar98 = vmaxps_avx(auVar94,auVar91);
          uVar21 = vcmpps_avx512vl(auVar98,auVar92,2);
          bVar81 = bVar81 & (byte)uVar21;
          if (bVar81 != 0) {
            auVar64._4_4_ = auVar97._4_4_ * auVar96._4_4_;
            auVar64._0_4_ = auVar97._0_4_ * auVar96._0_4_;
            auVar64._8_4_ = auVar97._8_4_ * auVar96._8_4_;
            auVar64._12_4_ = auVar97._12_4_ * auVar96._12_4_;
            auVar64._16_4_ = auVar97._16_4_ * auVar96._16_4_;
            auVar64._20_4_ = auVar97._20_4_ * auVar96._20_4_;
            auVar64._24_4_ = auVar97._24_4_ * auVar96._24_4_;
            auVar64._28_4_ = auVar98._28_4_;
            auVar7 = vfmsub231ps_fma(auVar64,auVar99,auVar104);
            auVar65._4_4_ = auVar104._4_4_ * auVar103._4_4_;
            auVar65._0_4_ = auVar104._0_4_ * auVar103._0_4_;
            auVar65._8_4_ = auVar104._8_4_ * auVar103._8_4_;
            auVar65._12_4_ = auVar104._12_4_ * auVar103._12_4_;
            auVar65._16_4_ = auVar104._16_4_ * auVar103._16_4_;
            auVar65._20_4_ = auVar104._20_4_ * auVar103._20_4_;
            auVar65._24_4_ = auVar104._24_4_ * auVar103._24_4_;
            auVar65._28_4_ = auVar104._28_4_;
            auVar6 = vfmsub231ps_fma(auVar65,auVar100,auVar97);
            auVar66._4_4_ = auVar99._4_4_ * auVar100._4_4_;
            auVar66._0_4_ = auVar99._0_4_ * auVar100._0_4_;
            auVar66._8_4_ = auVar99._8_4_ * auVar100._8_4_;
            auVar66._12_4_ = auVar99._12_4_ * auVar100._12_4_;
            auVar66._16_4_ = auVar99._16_4_ * auVar100._16_4_;
            auVar66._20_4_ = auVar99._20_4_ * auVar100._20_4_;
            auVar66._24_4_ = auVar99._24_4_ * auVar100._24_4_;
            auVar66._28_4_ = auVar99._28_4_;
            auVar8 = vfmsub231ps_fma(auVar66,auVar103,auVar96);
            auVar85 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar6),ZEXT1632(auVar8));
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar85),ZEXT1632(auVar7),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar98 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
            auVar30._8_4_ = 0x3f800000;
            auVar30._0_8_ = 0x3f8000003f800000;
            auVar30._12_4_ = 0x3f800000;
            auVar30._16_4_ = 0x3f800000;
            auVar30._20_4_ = 0x3f800000;
            auVar30._24_4_ = 0x3f800000;
            auVar30._28_4_ = 0x3f800000;
            auVar96 = vfnmadd213ps_avx512vl(auVar98,ZEXT1632(auVar86),auVar30);
            auVar85 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
            auVar187 = ZEXT1664(auVar85);
            auVar67._4_4_ = auVar8._4_4_ * auVar120._4_4_;
            auVar67._0_4_ = auVar8._0_4_ * auVar120._0_4_;
            auVar67._8_4_ = auVar8._8_4_ * auVar120._8_4_;
            auVar67._12_4_ = auVar8._12_4_ * auVar120._12_4_;
            auVar67._16_4_ = fVar144 * 0.0;
            auVar67._20_4_ = fVar163 * 0.0;
            auVar67._24_4_ = fVar153 * 0.0;
            auVar67._28_4_ = iVar1;
            auVar6 = vfmadd231ps_fma(auVar67,auVar101,ZEXT1632(auVar6));
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar102,ZEXT1632(auVar7));
            fVar153 = auVar85._0_4_;
            fVar144 = auVar85._4_4_;
            fVar145 = auVar85._8_4_;
            fVar146 = auVar85._12_4_;
            local_240._28_4_ = auVar98._28_4_;
            local_240._0_28_ =
                 ZEXT1628(CONCAT412(auVar6._12_4_ * fVar146,
                                    CONCAT48(auVar6._8_4_ * fVar145,
                                             CONCAT44(auVar6._4_4_ * fVar144,auVar6._0_4_ * fVar153)
                                            )));
            auVar191 = ZEXT3264(local_240);
            uVar21 = vcmpps_avx512vl(local_240,local_3c0,0xd);
            fVar163 = (ray->super_RayK<1>).tfar;
            auVar31._4_4_ = fVar163;
            auVar31._0_4_ = fVar163;
            auVar31._8_4_ = fVar163;
            auVar31._12_4_ = fVar163;
            auVar31._16_4_ = fVar163;
            auVar31._20_4_ = fVar163;
            auVar31._24_4_ = fVar163;
            auVar31._28_4_ = fVar163;
            uVar23 = vcmpps_avx512vl(local_240,auVar31,2);
            bVar81 = (byte)uVar21 & (byte)uVar23 & bVar81;
            if (bVar81 != 0) {
              uVar82 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar82 = bVar81 & uVar82;
              if ((char)uVar82 != '\0') {
                fVar163 = auVar94._0_4_ * fVar153;
                fVar172 = auVar94._4_4_ * fVar144;
                auVar68._4_4_ = fVar172;
                auVar68._0_4_ = fVar163;
                fVar173 = auVar94._8_4_ * fVar145;
                auVar68._8_4_ = fVar173;
                fVar174 = auVar94._12_4_ * fVar146;
                auVar68._12_4_ = fVar174;
                fVar181 = auVar94._16_4_ * 0.0;
                auVar68._16_4_ = fVar181;
                fVar83 = auVar94._20_4_ * 0.0;
                auVar68._20_4_ = fVar83;
                fVar84 = auVar94._24_4_ * 0.0;
                auVar68._24_4_ = fVar84;
                auVar68._28_4_ = auVar94._28_4_;
                auVar162._8_4_ = 0x3f800000;
                auVar162._0_8_ = 0x3f8000003f800000;
                auVar162._12_4_ = 0x3f800000;
                auVar162._16_4_ = 0x3f800000;
                auVar162._20_4_ = 0x3f800000;
                auVar162._24_4_ = 0x3f800000;
                auVar162._28_4_ = 0x3f800000;
                auVar98 = vsubps_avx(auVar162,auVar68);
                local_280._0_4_ =
                     (float)((uint)(bVar69 & 1) * (int)fVar163 |
                            (uint)!(bool)(bVar69 & 1) * auVar98._0_4_);
                bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
                local_280._4_4_ =
                     (float)((uint)bVar15 * (int)fVar172 | (uint)!bVar15 * auVar98._4_4_);
                bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
                local_280._8_4_ =
                     (float)((uint)bVar15 * (int)fVar173 | (uint)!bVar15 * auVar98._8_4_);
                bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
                local_280._12_4_ =
                     (float)((uint)bVar15 * (int)fVar174 | (uint)!bVar15 * auVar98._12_4_);
                bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                local_280._16_4_ =
                     (float)((uint)bVar15 * (int)fVar181 | (uint)!bVar15 * auVar98._16_4_);
                bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                local_280._20_4_ =
                     (float)((uint)bVar15 * (int)fVar83 | (uint)!bVar15 * auVar98._20_4_);
                bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
                local_280._24_4_ =
                     (float)((uint)bVar15 * (int)fVar84 | (uint)!bVar15 * auVar98._24_4_);
                bVar15 = SUB81(uVar70 >> 7,0);
                local_280._28_4_ =
                     (float)((uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar98._28_4_);
                auVar98 = vsubps_avx(auVar90,auVar95);
                auVar85 = vfmadd213ps_fma(auVar98,local_280,auVar95);
                fVar163 = pre->depth_scale;
                auVar32._4_4_ = fVar163;
                auVar32._0_4_ = fVar163;
                auVar32._8_4_ = fVar163;
                auVar32._12_4_ = fVar163;
                auVar32._16_4_ = fVar163;
                auVar32._20_4_ = fVar163;
                auVar32._24_4_ = fVar163;
                auVar32._28_4_ = fVar163;
                auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar85._12_4_ + auVar85._12_4_,
                                                             CONCAT48(auVar85._8_4_ + auVar85._8_4_,
                                                                      CONCAT44(auVar85._4_4_ +
                                                                               auVar85._4_4_,
                                                                               auVar85._0_4_ +
                                                                               auVar85._0_4_)))),
                                          auVar32);
                uVar22 = vcmpps_avx512vl(local_240,auVar98,6);
                uVar82 = uVar82 & uVar22;
                bVar81 = (byte)uVar82;
                if (bVar81 != 0) {
                  auVar152._0_4_ = auVar91._0_4_ * fVar153;
                  auVar152._4_4_ = auVar91._4_4_ * fVar144;
                  auVar152._8_4_ = auVar91._8_4_ * fVar145;
                  auVar152._12_4_ = auVar91._12_4_ * fVar146;
                  auVar152._16_4_ = auVar91._16_4_ * 0.0;
                  auVar152._20_4_ = auVar91._20_4_ * 0.0;
                  auVar152._24_4_ = auVar91._24_4_ * 0.0;
                  auVar152._28_4_ = 0;
                  auVar171._8_4_ = 0x3f800000;
                  auVar171._0_8_ = 0x3f8000003f800000;
                  auVar171._12_4_ = 0x3f800000;
                  auVar171._16_4_ = 0x3f800000;
                  auVar171._20_4_ = 0x3f800000;
                  auVar171._24_4_ = 0x3f800000;
                  auVar171._28_4_ = 0x3f800000;
                  auVar98 = vsubps_avx(auVar171,auVar152);
                  auVar125._0_4_ =
                       (uint)(bVar69 & 1) * (int)auVar152._0_4_ |
                       (uint)!(bool)(bVar69 & 1) * auVar98._0_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar125._4_4_ =
                       (uint)bVar15 * (int)auVar152._4_4_ | (uint)!bVar15 * auVar98._4_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar125._8_4_ =
                       (uint)bVar15 * (int)auVar152._8_4_ | (uint)!bVar15 * auVar98._8_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar125._12_4_ =
                       (uint)bVar15 * (int)auVar152._12_4_ | (uint)!bVar15 * auVar98._12_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                  auVar125._16_4_ =
                       (uint)bVar15 * (int)auVar152._16_4_ | (uint)!bVar15 * auVar98._16_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                  auVar125._20_4_ =
                       (uint)bVar15 * (int)auVar152._20_4_ | (uint)!bVar15 * auVar98._20_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
                  auVar125._24_4_ =
                       (uint)bVar15 * (int)auVar152._24_4_ | (uint)!bVar15 * auVar98._24_4_;
                  auVar125._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar98._28_4_;
                  auVar33._8_4_ = 0x40000000;
                  auVar33._0_8_ = 0x4000000040000000;
                  auVar33._12_4_ = 0x40000000;
                  auVar33._16_4_ = 0x40000000;
                  auVar33._20_4_ = 0x40000000;
                  auVar33._24_4_ = 0x40000000;
                  auVar33._28_4_ = 0x40000000;
                  local_260 = vfmsub132ps_avx512vl(auVar125,auVar171,auVar33);
                  local_220 = (int)lVar78;
                  local_21c = iVar76;
                  local_210 = local_4b0._0_8_;
                  uStack_208 = local_4b0._8_8_;
                  local_200 = local_4d0._0_8_;
                  uStack_1f8 = local_4d0._8_8_;
                  local_1f0 = local_4e0._0_8_;
                  uStack_1e8 = local_4e0._8_8_;
                  local_1e0 = local_4c0;
                  uStack_1d8 = uStack_4b8;
                  pGVar13 = (context->scene->geometries).items[local_550].ptr;
                  if ((pGVar13->mask & (ray->super_RayK<1>).mask) != 0) {
                    auVar85 = vcvtsi2ss_avx512f(auVar89,(int)lVar78);
                    fVar163 = auVar85._0_4_;
                    local_1c0[0] = (fVar163 + local_280._0_4_ + 0.0) * local_3a0;
                    local_1c0[1] = (fVar163 + local_280._4_4_ + 1.0) * fStack_39c;
                    local_1c0[2] = (fVar163 + local_280._8_4_ + 2.0) * fStack_398;
                    local_1c0[3] = (fVar163 + local_280._12_4_ + 3.0) * fStack_394;
                    fStack_1b0 = (fVar163 + local_280._16_4_ + 4.0) * fStack_390;
                    fStack_1ac = (fVar163 + local_280._20_4_ + 5.0) * fStack_38c;
                    fStack_1a8 = (fVar163 + local_280._24_4_ + 6.0) * fStack_388;
                    fStack_1a4 = fVar163 + local_280._28_4_ + 7.0;
                    local_1a0 = local_260;
                    local_180 = local_240;
                    auVar141._8_4_ = 0x7f800000;
                    auVar141._0_8_ = 0x7f8000007f800000;
                    auVar141._12_4_ = 0x7f800000;
                    auVar141._16_4_ = 0x7f800000;
                    auVar141._20_4_ = 0x7f800000;
                    auVar141._24_4_ = 0x7f800000;
                    auVar141._28_4_ = 0x7f800000;
                    auVar98 = vblendmps_avx512vl(auVar141,local_240);
                    auVar126._0_4_ =
                         (uint)(bVar81 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000
                    ;
                    bVar15 = (bool)((byte)(uVar82 >> 1) & 1);
                    auVar126._4_4_ = (uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar82 >> 2) & 1);
                    auVar126._8_4_ = (uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar82 >> 3) & 1);
                    auVar126._12_4_ = (uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar82 >> 4) & 1);
                    auVar126._16_4_ = (uint)bVar15 * auVar98._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar82 >> 5) & 1);
                    auVar126._20_4_ = (uint)bVar15 * auVar98._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar82 >> 6) & 1);
                    auVar126._24_4_ = (uint)bVar15 * auVar98._24_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = SUB81(uVar82 >> 7,0);
                    auVar126._28_4_ = (uint)bVar15 * auVar98._28_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar98 = vshufps_avx(auVar126,auVar126,0xb1);
                    auVar98 = vminps_avx(auVar126,auVar98);
                    auVar96 = vshufpd_avx(auVar98,auVar98,5);
                    auVar98 = vminps_avx(auVar98,auVar96);
                    auVar96 = vpermpd_avx2(auVar98,0x4e);
                    auVar98 = vminps_avx(auVar98,auVar96);
                    uVar21 = vcmpps_avx512vl(auVar126,auVar98,0);
                    uVar72 = (uint)uVar82;
                    if ((bVar81 & (byte)uVar21) != 0) {
                      uVar72 = (uint)(bVar81 & (byte)uVar21);
                    }
                    uVar73 = 0;
                    for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar70 = (ulong)uVar73;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar13->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_420 = vmovdqa64_avx512vl(auVar210._0_32_);
                      local_468 = uVar79;
                      local_540 = CONCAT44(local_540._4_4_,iVar76);
                      local_440 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                      local_460 = local_240;
                      do {
                        local_494 = local_1c0[uVar70];
                        local_490 = *(undefined4 *)(local_1a0 + uVar70 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar70 * 4);
                        local_510.context = context->user;
                        fVar153 = 1.0 - local_494;
                        fVar163 = fVar153 * fVar153 * -3.0;
                        auVar180 = ZEXT464((uint)fVar163);
                        auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar153 * fVar153)),
                                                  ZEXT416((uint)(local_494 * fVar153)),
                                                  ZEXT416(0xc0000000));
                        auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_494 * fVar153)),
                                                  ZEXT416((uint)(local_494 * local_494)),
                                                  ZEXT416(0x40000000));
                        fVar153 = auVar85._0_4_ * 3.0;
                        fVar144 = auVar86._0_4_ * 3.0;
                        fVar145 = local_494 * local_494 * 3.0;
                        auVar184._0_4_ = fVar145 * (float)local_4c0._0_4_;
                        auVar184._4_4_ = fVar145 * (float)local_4c0._4_4_;
                        auVar184._8_4_ = fVar145 * (float)uStack_4b8;
                        auVar184._12_4_ = fVar145 * uStack_4b8._4_4_;
                        auVar187 = ZEXT1664(auVar184);
                        auVar158._4_4_ = fVar144;
                        auVar158._0_4_ = fVar144;
                        auVar158._8_4_ = fVar144;
                        auVar158._12_4_ = fVar144;
                        auVar85 = vfmadd132ps_fma(auVar158,auVar184,local_4e0);
                        auVar166._4_4_ = fVar153;
                        auVar166._0_4_ = fVar153;
                        auVar166._8_4_ = fVar153;
                        auVar166._12_4_ = fVar153;
                        auVar85 = vfmadd132ps_fma(auVar166,auVar85,local_4d0);
                        auVar159._4_4_ = fVar163;
                        auVar159._0_4_ = fVar163;
                        auVar159._8_4_ = fVar163;
                        auVar159._12_4_ = fVar163;
                        auVar85 = vfmadd132ps_fma(auVar159,auVar85,local_4b0);
                        local_4a0 = vmovlps_avx(auVar85);
                        local_498 = vextractps_avx(auVar85,2);
                        local_48c = (int)local_528;
                        local_488 = (int)local_550;
                        local_484 = (local_510.context)->instID[0];
                        local_480 = (local_510.context)->instPrimID[0];
                        local_554 = -1;
                        local_510.valid = &local_554;
                        local_510.geometryUserPtr = pGVar13->userPtr;
                        local_510.ray = (RTCRayN *)ray;
                        local_510.hit = (RTCHitN *)&local_4a0;
                        local_510.N = 1;
                        if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01a1a85c:
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar180 = ZEXT1664(auVar180._0_16_);
                            auVar187 = ZEXT1664(auVar187._0_16_);
                            (*p_Var14)(&local_510);
                            auVar191 = ZEXT3264(local_460);
                            context = local_538;
                            ray = local_530;
                            if (*local_510.valid == 0) goto LAB_01a1a8fa;
                          }
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).components[0] =
                               *(float *)local_510.hit;
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_510.hit + 4);
                          (((Vec3f *)((long)local_510.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_510.hit + 8);
                          *(float *)((long)local_510.ray + 0x3c) = *(float *)(local_510.hit + 0xc);
                          *(float *)((long)local_510.ray + 0x40) = *(float *)(local_510.hit + 0x10);
                          *(float *)((long)local_510.ray + 0x44) = *(float *)(local_510.hit + 0x14);
                          *(float *)((long)local_510.ray + 0x48) = *(float *)(local_510.hit + 0x18);
                          *(float *)((long)local_510.ray + 0x4c) = *(float *)(local_510.hit + 0x1c);
                          *(float *)((long)local_510.ray + 0x50) = *(float *)(local_510.hit + 0x20);
                        }
                        else {
                          auVar180 = ZEXT464((uint)fVar163);
                          auVar187 = ZEXT1664(auVar184);
                          (*pGVar13->intersectionFilterN)(&local_510);
                          auVar191 = ZEXT3264(local_460);
                          context = local_538;
                          ray = local_530;
                          if (*local_510.valid != 0) goto LAB_01a1a85c;
LAB_01a1a8fa:
                          (local_530->super_RayK<1>).tfar = (float)local_440._0_4_;
                          context = local_538;
                          ray = local_530;
                        }
                        bVar81 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar82;
                        fVar163 = (ray->super_RayK<1>).tfar;
                        auVar34._4_4_ = fVar163;
                        auVar34._0_4_ = fVar163;
                        auVar34._8_4_ = fVar163;
                        auVar34._12_4_ = fVar163;
                        auVar34._16_4_ = fVar163;
                        auVar34._20_4_ = fVar163;
                        auVar34._24_4_ = fVar163;
                        auVar34._28_4_ = fVar163;
                        uVar21 = vcmpps_avx512vl(auVar191._0_32_,auVar34,2);
                        if ((bVar81 & (byte)uVar21) == 0) goto LAB_01a1a995;
                        local_440 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                        bVar81 = bVar81 & (byte)uVar21;
                        uVar82 = (ulong)bVar81;
                        auVar142._8_4_ = 0x7f800000;
                        auVar142._0_8_ = 0x7f8000007f800000;
                        auVar142._12_4_ = 0x7f800000;
                        auVar142._16_4_ = 0x7f800000;
                        auVar142._20_4_ = 0x7f800000;
                        auVar142._24_4_ = 0x7f800000;
                        auVar142._28_4_ = 0x7f800000;
                        auVar98 = vblendmps_avx512vl(auVar142,auVar191._0_32_);
                        auVar127._0_4_ =
                             (uint)(bVar81 & 1) * auVar98._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar81 >> 1 & 1);
                        auVar127._4_4_ = (uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar81 >> 2 & 1);
                        auVar127._8_4_ = (uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar81 >> 3 & 1);
                        auVar127._12_4_ = (uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar81 >> 4 & 1);
                        auVar127._16_4_ = (uint)bVar15 * auVar98._16_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar81 >> 5 & 1);
                        auVar127._20_4_ = (uint)bVar15 * auVar98._20_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar81 >> 6 & 1);
                        auVar127._24_4_ = (uint)bVar15 * auVar98._24_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        auVar127._28_4_ =
                             (uint)(bVar81 >> 7) * auVar98._28_4_ |
                             (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                        auVar98 = vshufps_avx(auVar127,auVar127,0xb1);
                        auVar98 = vminps_avx(auVar127,auVar98);
                        auVar96 = vshufpd_avx(auVar98,auVar98,5);
                        auVar98 = vminps_avx(auVar98,auVar96);
                        auVar96 = vpermpd_avx2(auVar98,0x4e);
                        auVar98 = vminps_avx(auVar98,auVar96);
                        uVar21 = vcmpps_avx512vl(auVar127,auVar98,0);
                        bVar69 = (byte)uVar21 & bVar81;
                        if (bVar69 != 0) {
                          bVar81 = bVar69;
                        }
                        uVar72 = 0;
                        for (uVar73 = (uint)bVar81; (uVar73 & 1) == 0;
                            uVar73 = uVar73 >> 1 | 0x80000000) {
                          uVar72 = uVar72 + 1;
                        }
                        uVar70 = (ulong)uVar72;
                      } while( true );
                    }
                    fVar163 = local_1c0[uVar70];
                    fVar153 = *(float *)(local_1a0 + uVar70 * 4);
                    fVar145 = 1.0 - fVar163;
                    fVar144 = fVar145 * fVar145 * -3.0;
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar145 * fVar145)),
                                              ZEXT416((uint)(fVar163 * fVar145)),ZEXT416(0xc0000000)
                                             );
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar163 * fVar145)),
                                              ZEXT416((uint)(fVar163 * fVar163)),ZEXT416(0x40000000)
                                             );
                    fVar145 = auVar85._0_4_ * 3.0;
                    fVar146 = auVar86._0_4_ * 3.0;
                    fVar172 = fVar163 * fVar163 * 3.0;
                    auVar183._0_4_ = fVar172 * (float)local_4c0._0_4_;
                    auVar183._4_4_ = fVar172 * (float)local_4c0._4_4_;
                    auVar183._8_4_ = fVar172 * (float)uStack_4b8;
                    auVar183._12_4_ = fVar172 * uStack_4b8._4_4_;
                    auVar187 = ZEXT1664(auVar183);
                    auVar156._4_4_ = fVar146;
                    auVar156._0_4_ = fVar146;
                    auVar156._8_4_ = fVar146;
                    auVar156._12_4_ = fVar146;
                    auVar85 = vfmadd132ps_fma(auVar156,auVar183,local_4e0);
                    auVar165._4_4_ = fVar145;
                    auVar165._0_4_ = fVar145;
                    auVar165._8_4_ = fVar145;
                    auVar165._12_4_ = fVar145;
                    auVar85 = vfmadd132ps_fma(auVar165,auVar85,local_4d0);
                    auVar157._4_4_ = fVar144;
                    auVar157._0_4_ = fVar144;
                    auVar157._8_4_ = fVar144;
                    auVar157._12_4_ = fVar144;
                    auVar180 = ZEXT464((uint)*(float *)(local_180 + uVar70 * 4));
                    (ray->super_RayK<1>).tfar = *(float *)(local_180 + uVar70 * 4);
                    auVar85 = vfmadd132ps_fma(auVar157,auVar85,local_4b0);
                    uVar21 = vmovlps_avx(auVar85);
                    *(undefined8 *)&(ray->Ng).field_0 = uVar21;
                    fVar144 = (float)vextractps_avx(auVar85,2);
                    (ray->Ng).field_0.field_0.z = fVar144;
                    ray->u = fVar163;
                    ray->v = fVar153;
                    ray->primID = (uint)local_528;
                    ray->geomID = (uint)local_550;
                    ray->instID[0] = context->user->instID[0];
                    ray->instPrimID[0] = context->user->instPrimID[0];
                    lVar80 = local_548;
                  }
                }
              }
            }
          }
        }
        goto LAB_01a1a6b2;
      }
    }
    fVar163 = (ray->super_RayK<1>).tfar;
    auVar29._4_4_ = fVar163;
    auVar29._0_4_ = fVar163;
    auVar29._8_4_ = fVar163;
    auVar29._12_4_ = fVar163;
    auVar29._16_4_ = fVar163;
    auVar29._20_4_ = fVar163;
    auVar29._24_4_ = fVar163;
    auVar29._28_4_ = fVar163;
    uVar21 = vcmpps_avx512vl(local_80,auVar29,2);
    uVar79 = (ulong)((uint)uVar79 & (uint)uVar79 + 0xff & (uint)uVar21);
  } while( true );
LAB_01a1a995:
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar207 = ZEXT3264(auVar98);
  auVar85 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar209 = ZEXT1664(auVar85);
  auVar208 = ZEXT3264(local_400);
  auVar98 = vmovdqa64_avx512vl(local_420);
  auVar210 = ZEXT3264(auVar98);
  pre = local_520;
  prim = local_518;
  uVar79 = local_468;
  lVar80 = local_548;
  iVar76 = (int)local_540;
LAB_01a1a6b2:
  lVar78 = lVar78 + 8;
  goto LAB_01a19e33;
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }